

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse2::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  Geometry *pGVar14;
  GridSOA *pGVar15;
  RTCFilterFunctionN p_Var16;
  _func_int *p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar27;
  int iVar28;
  long lVar29;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  ulong uVar31;
  long lVar32;
  RTCRayN *pRVar33;
  ulong uVar34;
  float *pfVar35;
  uint uVar36;
  undefined4 uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  Primitive_conflict3 *prim;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar66;
  undefined1 auVar67 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  float fVar72;
  float fVar73;
  float fVar93;
  float fVar94;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar95;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  float fVar135;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar146;
  float fVar156;
  float fVar157;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar158;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [16];
  float fVar164;
  float fVar165;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar190;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar202 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  int iVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  int iVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  int iVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  float fStack_12cc;
  undefined8 local_12b8;
  float local_12a8;
  float fStack_12a4;
  float fStack_129c;
  undefined8 local_1288;
  float fStack_1280;
  float fStack_127c;
  undefined8 local_1258;
  undefined8 uStack_1250;
  vbool<4> valid;
  undefined1 local_1238 [16];
  Geometry *local_1228;
  float *local_1220;
  ulong local_1218;
  ulong local_1210;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1168 [4];
  float local_1158 [4];
  float local_1148 [4];
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  float local_1118 [4];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined8 local_10f8;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined8 local_10d8;
  float fStack_10d0;
  float fStack_10cc;
  undefined4 local_10c8;
  undefined4 uStack_10c4;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  uint local_1058;
  uint uStack_1054;
  uint uStack_1050;
  uint uStack_104c;
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar131;
  
  pSVar30 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar56 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar55 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar72 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar57 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar69 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar28 = (tray->tnear).field_0.i[k];
  iVar216 = (tray->tfar).field_0.i[k];
  auVar150._4_4_ = iVar216;
  auVar150._0_4_ = iVar216;
  auVar150._8_4_ = iVar216;
  auVar150._12_4_ = iVar216;
  lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_fd8 = fVar56;
  fStack_fd4 = fVar56;
  fStack_fd0 = fVar56;
  fStack_fcc = fVar56;
  local_fe8 = fVar55;
  fStack_fe4 = fVar55;
  fStack_fe0 = fVar55;
  fStack_fdc = fVar55;
  local_ff8 = fVar72;
  fStack_ff4 = fVar72;
  fStack_ff0 = fVar72;
  fStack_fec = fVar72;
  local_1008 = fVar57;
  fStack_1004 = fVar57;
  fStack_1000 = fVar57;
  fStack_ffc = fVar57;
  local_1018 = fVar69;
  fStack_1014 = fVar69;
  fStack_1010 = fVar69;
  fStack_100c = fVar69;
  local_1028 = fVar70;
  fStack_1024 = fVar70;
  fStack_1020 = fVar70;
  fStack_101c = fVar70;
  local_1038 = iVar28;
  iStack_1034 = iVar28;
  iStack_1030 = iVar28;
  iStack_102c = iVar28;
  local_1228 = (Geometry *)pre;
  fVar179 = fVar69;
  fVar177 = fVar69;
  fVar175 = fVar69;
  fVar173 = fVar57;
  fVar171 = fVar57;
  fVar165 = fVar57;
  fVar162 = fVar72;
  fVar146 = fVar72;
  fVar161 = fVar72;
  fVar159 = fVar55;
  fVar156 = fVar55;
  fVar135 = fVar55;
  fVar125 = fVar56;
  fVar95 = fVar56;
  fVar94 = fVar56;
  iVar224 = iVar28;
  iVar220 = iVar28;
  iVar216 = iVar28;
  fVar93 = fVar70;
  fVar73 = fVar70;
  fVar71 = fVar70;
LAB_002039f9:
  do {
    pSVar27 = pSVar30 + -1;
    pSVar30 = pSVar30 + -1;
    if ((float)pSVar27->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar27->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar42 = (pSVar30->ptr).ptr;
      while ((uVar42 & 8) == 0) {
        uVar34 = uVar42 & 0xfffffffffffffff0;
        fVar157 = *(float *)(ray + k * 4 + 0x70);
        pfVar10 = (float *)(uVar34 + 0x80 + uVar40);
        pfVar8 = (float *)(uVar34 + 0x20 + uVar40);
        auVar114._0_4_ = ((*pfVar10 * fVar157 + *pfVar8) - fVar94) * fVar165;
        auVar114._4_4_ = ((pfVar10[1] * fVar157 + pfVar8[1]) - fVar95) * fVar171;
        auVar114._8_4_ = ((pfVar10[2] * fVar157 + pfVar8[2]) - fVar125) * fVar173;
        auVar114._12_4_ = ((pfVar10[3] * fVar157 + pfVar8[3]) - fVar56) * fVar57;
        auVar96._4_4_ = iVar220;
        auVar96._0_4_ = iVar216;
        auVar96._8_4_ = iVar224;
        auVar96._12_4_ = iVar28;
        auVar96 = maxps(auVar96,auVar114);
        pfVar10 = (float *)(uVar34 + 0x80 + uVar41);
        pfVar8 = (float *)(uVar34 + 0x20 + uVar41);
        auVar130._0_4_ = ((*pfVar10 * fVar157 + *pfVar8) - fVar135) * fVar175;
        auVar130._4_4_ = ((pfVar10[1] * fVar157 + pfVar8[1]) - fVar156) * fVar177;
        auVar130._8_4_ = ((pfVar10[2] * fVar157 + pfVar8[2]) - fVar159) * fVar179;
        auVar130._12_4_ = ((pfVar10[3] * fVar157 + pfVar8[3]) - fVar55) * fVar69;
        pfVar10 = (float *)(uVar34 + 0x80 + uVar38);
        pfVar8 = (float *)(uVar34 + 0x20 + uVar38);
        auVar148._0_4_ = ((*pfVar10 * fVar157 + *pfVar8) - fVar161) * fVar71;
        auVar148._4_4_ = ((pfVar10[1] * fVar157 + pfVar8[1]) - fVar146) * fVar73;
        auVar148._8_4_ = ((pfVar10[2] * fVar157 + pfVar8[2]) - fVar162) * fVar93;
        auVar148._12_4_ = ((pfVar10[3] * fVar157 + pfVar8[3]) - fVar72) * fVar70;
        auVar114 = maxps(auVar130,auVar148);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar96,auVar114);
        pfVar10 = (float *)(uVar34 + 0x80 + (uVar40 ^ 0x10));
        pfVar8 = (float *)(uVar34 + 0x20 + (uVar40 ^ 0x10));
        auVar126._0_4_ = ((*pfVar10 * fVar157 + *pfVar8) - fVar94) * fVar165;
        auVar126._4_4_ = ((pfVar10[1] * fVar157 + pfVar8[1]) - fVar95) * fVar171;
        auVar126._8_4_ = ((pfVar10[2] * fVar157 + pfVar8[2]) - fVar125) * fVar173;
        auVar126._12_4_ = ((pfVar10[3] * fVar157 + pfVar8[3]) - fVar56) * fVar57;
        pfVar10 = (float *)(uVar34 + 0x80 + (uVar41 ^ 0x10));
        pfVar8 = (float *)(uVar34 + 0x20 + (uVar41 ^ 0x10));
        auVar136._0_4_ = ((*pfVar10 * fVar157 + *pfVar8) - fVar135) * fVar175;
        auVar136._4_4_ = ((pfVar10[1] * fVar157 + pfVar8[1]) - fVar156) * fVar177;
        auVar136._8_4_ = ((pfVar10[2] * fVar157 + pfVar8[2]) - fVar159) * fVar179;
        auVar136._12_4_ = ((pfVar10[3] * fVar157 + pfVar8[3]) - fVar55) * fVar69;
        pfVar10 = (float *)(uVar34 + 0x80 + (uVar38 ^ 0x10));
        pfVar8 = (float *)(uVar34 + 0x20 + (uVar38 ^ 0x10));
        auVar138._0_4_ = ((*pfVar10 * fVar157 + *pfVar8) - fVar161) * fVar71;
        auVar138._4_4_ = ((pfVar10[1] * fVar157 + pfVar8[1]) - fVar146) * fVar73;
        auVar138._8_4_ = ((pfVar10[2] * fVar157 + pfVar8[2]) - fVar162) * fVar93;
        auVar138._12_4_ = ((pfVar10[3] * fVar157 + pfVar8[3]) - fVar72) * fVar70;
        auVar114 = minps(auVar136,auVar138);
        auVar96 = minps(auVar150,auVar126);
        auVar96 = minps(auVar96,auVar114);
        if (((uint)uVar42 & 7) == 6) {
          bVar18 = (fVar157 < *(float *)(uVar34 + 0xf0) && *(float *)(uVar34 + 0xe0) <= fVar157) &&
                   tNear.field_0._0_4_ <= auVar96._0_4_;
          bVar19 = (fVar157 < *(float *)(uVar34 + 0xf4) && *(float *)(uVar34 + 0xe4) <= fVar157) &&
                   tNear.field_0._4_4_ <= auVar96._4_4_;
          bVar20 = (fVar157 < *(float *)(uVar34 + 0xf8) && *(float *)(uVar34 + 0xe8) <= fVar157) &&
                   tNear.field_0._8_4_ <= auVar96._8_4_;
          bVar21 = (fVar157 < *(float *)(uVar34 + 0xfc) && *(float *)(uVar34 + 0xec) <= fVar157) &&
                   tNear.field_0._12_4_ <= auVar96._12_4_;
        }
        else {
          bVar18 = tNear.field_0._0_4_ <= auVar96._0_4_;
          bVar19 = tNear.field_0._4_4_ <= auVar96._4_4_;
          bVar20 = tNear.field_0._8_4_ <= auVar96._8_4_;
          bVar21 = tNear.field_0._12_4_ <= auVar96._12_4_;
        }
        auVar74._0_4_ = (uint)bVar18 * -0x80000000;
        auVar74._4_4_ = (uint)bVar19 * -0x80000000;
        auVar74._8_4_ = (uint)bVar20 * -0x80000000;
        auVar74._12_4_ = (uint)bVar21 * -0x80000000;
        uVar36 = movmskps((int)root.ptr,auVar74);
        root.ptr = (size_t)uVar36;
        if (uVar36 == 0) {
          if (pSVar30 == stack) {
            return;
          }
          goto LAB_002039f9;
        }
        root.ptr = 0;
        if ((byte)uVar36 != 0) {
          for (; ((byte)uVar36 >> root.ptr & 1) == 0;
              root.ptr = (long)&(((Geometry *)root.ptr)->super_RefCount)._vptr_RefCount + 1) {
          }
        }
        uVar42 = *(ulong *)(uVar34 + root.ptr * 8);
        uVar36 = (uVar36 & 0xff) - 1 & uVar36 & 0xff;
        if (uVar36 != 0) {
          uVar43 = tNear.field_0.i[root.ptr];
          lVar32 = 0;
          if (uVar36 != 0) {
            for (; (uVar36 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
            }
          }
          uVar31 = *(ulong *)(uVar34 + lVar32 * 8);
          uVar44 = tNear.field_0.i[lVar32];
          uVar36 = uVar36 - 1 & uVar36;
          root.ptr = (size_t)uVar36;
          if (uVar36 == 0) {
            if (uVar43 < uVar44) {
              (pSVar30->ptr).ptr = uVar31;
              pSVar30->dist = uVar44;
              pSVar30 = pSVar30 + 1;
            }
            else {
              (pSVar30->ptr).ptr = uVar42;
              pSVar30->dist = uVar43;
              pSVar30 = pSVar30 + 1;
              uVar42 = uVar31;
            }
          }
          else {
            auVar75._8_4_ = uVar43;
            auVar75._0_8_ = uVar42;
            auVar75._12_4_ = 0;
            auVar97._8_4_ = uVar44;
            auVar97._0_8_ = uVar31;
            auVar97._12_4_ = 0;
            lVar32 = 0;
            if ((Geometry *)root.ptr != (Geometry *)0x0) {
              for (; (uVar36 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            uVar42 = *(ulong *)(uVar34 + lVar32 * 8);
            iVar12 = tNear.field_0.i[lVar32];
            auVar115._8_4_ = iVar12;
            auVar115._0_8_ = uVar42;
            auVar115._12_4_ = 0;
            auVar127._8_4_ = -(uint)((int)uVar43 < (int)uVar44);
            uVar36 = uVar36 - 1 & uVar36;
            if (uVar36 == 0) {
              auVar127._4_4_ = auVar127._8_4_;
              auVar127._0_4_ = auVar127._8_4_;
              auVar127._12_4_ = auVar127._8_4_;
              auVar96 = auVar75 & auVar127 | ~auVar127 & auVar97;
              auVar114 = auVar97 & auVar127 | ~auVar127 & auVar75;
              auVar128._8_4_ = -(uint)(auVar96._8_4_ < iVar12);
              auVar128._0_8_ = CONCAT44(auVar128._8_4_,auVar128._8_4_);
              auVar128._12_4_ = auVar128._8_4_;
              uVar42 = ~auVar128._0_8_ & uVar42 | auVar96._0_8_ & auVar128._0_8_;
              auVar96 = auVar115 & auVar128 | ~auVar128 & auVar96;
              auVar76._8_4_ = -(uint)(auVar114._8_4_ < auVar96._8_4_);
              auVar76._4_4_ = auVar76._8_4_;
              auVar76._0_4_ = auVar76._8_4_;
              auVar76._12_4_ = auVar76._8_4_;
              *pSVar30 = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar76 & auVar114 | auVar96 & auVar76);
              pSVar30[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (auVar114 & auVar76 | ~auVar76 & auVar96);
              pSVar30 = pSVar30 + 2;
            }
            else {
              root.ptr = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> root.ptr & 1) == 0;
                    root.ptr = (long)&(((Geometry *)root.ptr)->super_RefCount)._vptr_RefCount + 1) {
                }
              }
              iVar13 = tNear.field_0.i[root.ptr];
              auVar137._8_4_ = iVar13;
              auVar137._0_8_ = *(undefined8 *)(uVar34 + root.ptr * 8);
              auVar137._12_4_ = 0;
              auVar129._4_4_ = auVar127._8_4_;
              auVar129._0_4_ = auVar127._8_4_;
              auVar129._8_4_ = auVar127._8_4_;
              auVar129._12_4_ = auVar127._8_4_;
              auVar96 = auVar75 & auVar129 | ~auVar129 & auVar97;
              auVar114 = auVar97 & auVar129 | ~auVar129 & auVar75;
              auVar147._0_4_ = -(uint)(iVar12 < iVar13);
              auVar147._4_4_ = -(uint)(iVar12 < iVar13);
              auVar147._8_4_ = -(uint)(iVar12 < iVar13);
              auVar147._12_4_ = -(uint)(iVar12 < iVar13);
              auVar130 = auVar115 & auVar147 | ~auVar147 & auVar137;
              auVar148 = ~auVar147 & auVar115 | auVar137 & auVar147;
              auVar116._8_4_ = -(uint)(auVar114._8_4_ < auVar148._8_4_);
              auVar116._4_4_ = auVar116._8_4_;
              auVar116._0_4_ = auVar116._8_4_;
              auVar116._12_4_ = auVar116._8_4_;
              auVar138 = auVar114 & auVar116 | ~auVar116 & auVar148;
              auVar98._8_4_ = -(uint)(auVar96._8_4_ < auVar130._8_4_);
              auVar98._0_8_ = CONCAT44(auVar98._8_4_,auVar98._8_4_);
              auVar98._12_4_ = auVar98._8_4_;
              uVar42 = auVar96._0_8_ & auVar98._0_8_ | ~auVar98._0_8_ & auVar130._0_8_;
              auVar96 = ~auVar98 & auVar96 | auVar130 & auVar98;
              auVar77._8_4_ = -(uint)(auVar96._8_4_ < auVar138._8_4_);
              auVar77._4_4_ = auVar77._8_4_;
              auVar77._0_4_ = auVar77._8_4_;
              auVar77._12_4_ = auVar77._8_4_;
              *pSVar30 = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar116 & auVar114 | auVar148 & auVar116);
              pSVar30[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar77 & auVar96 | auVar138 & auVar77);
              pSVar30[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (auVar96 & auVar77 | ~auVar77 & auVar138);
              pSVar30 = pSVar30 + 3;
            }
          }
        }
      }
      if (((uint)uVar42 & 0xf) == 8) {
        local_10d8 = (Geometry *)(local_1228->super_RefCount)._vptr_RefCount;
        fVar72 = (float)((int)(local_10d8->super_RefCount).refCounter.
                              super___atomic_base<unsigned_long>._M_i - 1);
        uVar34 = (ulong)*(uint *)((long)&(local_10d8->super_RefCount).refCounter.
                                         super___atomic_base<unsigned_long>._M_i + 4);
        fVar55 = *(float *)(ray + k * 4 + 0x70) * fVar72;
        fVar56 = floorf(fVar55);
        fVar72 = fVar72 + -1.0;
        if (fVar72 <= fVar56) {
          fVar56 = fVar72;
        }
        fVar72 = 0.0;
        if (0.0 <= fVar56) {
          fVar72 = fVar56;
        }
        fVar55 = fVar55 - fVar72;
        lVar32 = (long)(int)fVar72 * (ulong)(uint)local_10d8->fnumTimeSegments +
                 (ulong)local_10d8->numTimeSteps;
        uVar36 = (uint)local_10d8->fnumTimeSegments >> 2;
        uVar31 = (ulong)*(uint *)((long)&local_10d8->device + 4);
        local_10f8 = (long)&(local_10d8->super_RefCount)._vptr_RefCount + (uVar42 >> 4) * 4 + lVar32
        ;
        lVar32 = (uVar42 >> 4) * 4 + lVar32;
        pfVar35 = (float *)((long)&(local_10d8->time_range).lower + lVar32);
        pfVar8 = (float *)(local_10f8 + 0x2c + uVar31 * 4);
        pfVar10 = (float *)(local_10f8 + 0x2c + uVar31 * 8);
        fVar56 = *(float *)((long)&(local_10d8->time_range).upper + lVar32);
        pfVar9 = (float *)(local_10f8 + 0x2c + uVar34 * 4);
        fVar72 = pfVar9[1];
        if (uVar34 == 2) {
          fVar57 = *pfVar8;
          fVar69 = pfVar8[1];
          fVar70 = pfVar8[2];
          fVar71 = pfVar8[3];
          uStack_12e0._0_4_ = fVar71;
          local_12e8 = *(undefined8 *)(pfVar8 + 2);
          uStack_12e0._4_4_ = fVar71;
          local_12a8 = *pfVar10;
          fVar73 = pfVar10[1];
          fStack_12a4 = pfVar10[2];
          fStack_129c = pfVar10[3];
          fStack_1280 = fStack_129c;
          local_1288 = *(undefined8 *)(pfVar10 + 2);
          fStack_127c = fStack_129c;
          uVar42 = (ulong)(uVar36 << 2);
          fVar93 = *(float *)((long)pfVar35 + uVar42);
          fVar94 = ((float *)((long)pfVar35 + uVar42))[1];
          fVar95 = *(float *)((long)pfVar35 + uVar42 + 8);
          fVar125 = *(float *)((long)pfVar35 + uVar42 + 0xc);
          fVar135 = *(float *)((long)pfVar8 + uVar42);
          fVar156 = ((float *)((long)pfVar8 + uVar42))[1];
          fVar159 = *(float *)((long)pfVar8 + uVar42 + 8);
          fVar161 = *(float *)((long)pfVar8 + uVar42 + 0xc);
          fVar146 = *(float *)((long)pfVar10 + uVar42);
          fVar162 = ((float *)((long)pfVar10 + uVar42))[1];
          fVar165 = *(float *)((long)pfVar10 + uVar42 + 8);
          fVar171 = *(float *)((long)pfVar10 + uVar42 + 0xc);
          fVar173 = fVar125;
          fVar175 = fVar161;
          fVar177 = fVar162;
          fVar179 = fVar171;
          fVar157 = fVar94;
          fVar158 = fVar156;
          fVar176 = fVar69;
          fVar181 = fVar73;
          fVar178 = fVar56;
          fStack_12cc = fVar72;
        }
        else {
          fVar57 = *pfVar8;
          fVar69 = pfVar8[1];
          pfVar1 = pfVar8 + uVar34;
          fVar70 = *pfVar1;
          fVar71 = pfVar1[1];
          uStack_12e0._0_4_ = fVar71;
          local_12e8 = *(undefined8 *)pfVar1;
          uStack_12e0._4_4_ = pfVar1[2];
          local_12a8 = *pfVar10;
          fVar73 = pfVar10[1];
          pfVar1 = pfVar10 + uVar34;
          fStack_12a4 = *pfVar1;
          fStack_129c = pfVar1[1];
          fStack_1280 = fStack_129c;
          local_1288 = *(undefined8 *)pfVar1;
          fStack_127c = pfVar1[2];
          uVar42 = (ulong)(uVar36 << 2);
          pfVar1 = (float *)((long)pfVar35 + uVar42);
          fVar93 = *pfVar1;
          fVar94 = pfVar1[1];
          pfVar2 = (float *)((long)pfVar35 + uVar34 * 4 + uVar42);
          fVar95 = *pfVar2;
          fVar125 = pfVar2[1];
          pfVar3 = (float *)((long)pfVar8 + uVar42);
          fVar135 = *pfVar3;
          fVar156 = pfVar3[1];
          pfVar4 = (float *)((long)pfVar8 + uVar34 * 4 + uVar42);
          fVar159 = *pfVar4;
          fVar161 = pfVar4[1];
          pfVar5 = (float *)((long)pfVar10 + uVar42);
          fVar146 = *pfVar5;
          fVar162 = pfVar5[1];
          pfVar6 = (float *)((long)pfVar10 + uVar34 * 4 + uVar42);
          fVar165 = *pfVar6;
          fVar171 = pfVar6[1];
          fVar173 = pfVar2[2];
          fVar175 = pfVar4[2];
          fVar177 = pfVar5[2];
          fVar179 = pfVar6[2];
          fVar157 = pfVar1[2];
          fVar158 = pfVar3[2];
          fVar176 = pfVar8[2];
          fVar181 = pfVar10[2];
          fVar178 = *(float *)((long)&local_10d8->mask + lVar32);
          fStack_12cc = pfVar9[2];
        }
        uVar36 = *(uint *)&local_10d8->device;
        uVar42 = (ulong)uVar36;
        lVar32 = uVar31 * 0xc + local_10f8;
        local_1220 = (float *)(lVar32 + 0x2c);
        local_10e8 = 1.0 - fVar55;
        fStack_10e4 = local_10e8;
        fStack_10e0 = local_10e8;
        fStack_10dc = local_10e8;
        fVar225 = *(float *)(ray + k * 4);
        fVar189 = *(float *)(ray + k * 4 + 0x10);
        fVar163 = *(float *)(ray + k * 4 + 0x20);
        fVar11 = *(float *)(ray + k * 4 + 0x40);
        fVar164 = (*pfVar35 * local_10e8 + fVar93 * fVar55) - fVar225;
        fVar170 = (*pfVar9 * local_10e8 + fVar95 * fVar55) - fVar225;
        fVar172 = (fVar56 * local_10e8 + fVar94 * fVar55) - fVar225;
        fVar174 = (fVar72 * local_10e8 + fVar125 * fVar55) - fVar225;
        local_1108 = (fVar57 * local_10e8 + fVar135 * fVar55) - fVar189;
        fStack_1104 = (fVar70 * local_10e8 + fVar159 * fVar55) - fVar189;
        fStack_1100 = (fVar69 * local_10e8 + fVar156 * fVar55) - fVar189;
        fStack_10fc = (fVar71 * local_10e8 + fVar161 * fVar55) - fVar189;
        fVar196 = (local_12a8 * local_10e8 + fVar146 * fVar55) - fVar163;
        fVar197 = (fStack_12a4 * local_10e8 + fVar165 * fVar55) - fVar163;
        fVar198 = (fVar73 * local_10e8 + fVar162 * fVar55) - fVar163;
        fVar199 = (fStack_129c * local_10e8 + fVar171 * fVar55) - fVar163;
        fVar190 = (fVar56 * local_10e8 + fVar94 * fVar55) - fVar225;
        fVar193 = (fVar56 * local_10e8 + fVar94 * fVar55) - fVar225;
        fVar194 = (fVar178 * local_10e8 + fVar157 * fVar55) - fVar225;
        fVar195 = (fVar178 * local_10e8 + fVar157 * fVar55) - fVar225;
        fVar146 = (fVar69 * local_10e8 + fVar156 * fVar55) - fVar189;
        fVar156 = (fVar69 * local_10e8 + fVar156 * fVar55) - fVar189;
        fVar157 = (fVar176 * local_10e8 + fVar158 * fVar55) - fVar189;
        fVar158 = (fVar176 * local_10e8 + fVar158 * fVar55) - fVar189;
        fVar176 = (fVar73 * local_10e8 + fVar162 * fVar55) - fVar163;
        fVar178 = (fVar73 * local_10e8 + fVar162 * fVar55) - fVar163;
        fVar180 = (fVar181 * local_10e8 + fVar177 * fVar55) - fVar163;
        fVar182 = (fVar181 * local_10e8 + fVar177 * fVar55) - fVar163;
        fVar213 = (*pfVar9 * local_10e8 + fVar95 * fVar55) - fVar225;
        fVar217 = (fVar72 * local_10e8 + fVar125 * fVar55) - fVar225;
        fVar221 = (fVar72 * local_10e8 + fVar125 * fVar55) - fVar225;
        fVar225 = (fStack_12cc * local_10e8 + fVar173 * fVar55) - fVar225;
        fVar184 = ((float)local_12e8 * local_10e8 + fVar159 * fVar55) - fVar189;
        fVar187 = (local_12e8._4_4_ * local_10e8 + fVar161 * fVar55) - fVar189;
        fVar188 = ((float)uStack_12e0 * local_10e8 + fVar161 * fVar55) - fVar189;
        fVar189 = (uStack_12e0._4_4_ * local_10e8 + fVar175 * fVar55) - fVar189;
        fVar159 = ((float)local_1288 * local_10e8 + fVar165 * fVar55) - fVar163;
        fVar161 = (local_1288._4_4_ * local_10e8 + fVar171 * fVar55) - fVar163;
        fVar162 = (fStack_1280 * local_10e8 + fVar171 * fVar55) - fVar163;
        fVar163 = (fStack_127c * local_10e8 + fVar179 * fVar55) - fVar163;
        local_f88 = fVar213 - fVar164;
        fStack_f84 = fVar217 - fVar170;
        fStack_f80 = fVar221 - fVar172;
        fStack_f7c = fVar225 - fVar174;
        local_fa8 = fVar184 - local_1108;
        fStack_fa4 = fVar187 - fStack_1104;
        fStack_fa0 = fVar188 - fStack_1100;
        fStack_f9c = fVar189 - fStack_10fc;
        local_f98 = fVar159 - fVar196;
        fStack_f94 = fVar161 - fVar197;
        fStack_f90 = fVar162 - fVar198;
        fStack_f8c = fVar163 - fVar199;
        fVar56 = *(float *)(ray + k * 4 + 0x50);
        fVar72 = *(float *)(ray + k * 4 + 0x60);
        fVar177 = fVar164 - fVar190;
        fVar179 = fVar170 - fVar193;
        fVar181 = fVar172 - fVar194;
        fVar183 = fVar174 - fVar195;
        fVar125 = (local_fa8 * (fVar159 + fVar196) - (fVar184 + local_1108) * local_f98) * fVar11 +
                  ((fVar213 + fVar164) * local_f98 - (fVar159 + fVar196) * local_f88) * fVar56 +
                  (local_f88 * (fVar184 + local_1108) - (fVar213 + fVar164) * local_fa8) * fVar72;
        fVar135 = (fStack_fa4 * (fVar161 + fVar197) - (fVar187 + fStack_1104) * fStack_f94) * fVar11
                  + ((fVar217 + fVar170) * fStack_f94 - (fVar161 + fVar197) * fStack_f84) * fVar56 +
                    (fStack_f84 * (fVar187 + fStack_1104) - (fVar217 + fVar170) * fStack_fa4) *
                    fVar72;
        aVar131._0_8_ = CONCAT44(fVar135,fVar125);
        aVar131._8_4_ =
             (fStack_fa0 * (fVar162 + fVar198) - (fVar188 + fStack_1100) * fStack_f90) * fVar11 +
             ((fVar221 + fVar172) * fStack_f90 - (fVar162 + fVar198) * fStack_f80) * fVar56 +
             (fStack_f80 * (fVar188 + fStack_1100) - (fVar221 + fVar172) * fStack_fa0) * fVar72;
        aVar131._12_4_ =
             (fStack_f9c * (fVar163 + fVar199) - (fVar189 + fStack_10fc) * fStack_f8c) * fVar11 +
             ((fVar225 + fVar174) * fStack_f8c - (fVar163 + fVar199) * fStack_f7c) * fVar56 +
             (fStack_f7c * (fVar189 + fStack_10fc) - (fVar225 + fVar174) * fStack_f9c) * fVar72;
        fVar73 = local_1108 - fVar146;
        fVar93 = fStack_1104 - fVar156;
        fVar94 = fStack_1100 - fVar157;
        fVar95 = fStack_10fc - fVar158;
        local_fb8 = fVar196 - fVar176;
        fStack_fb4 = fVar197 - fVar178;
        fStack_fb0 = fVar198 - fVar180;
        fStack_fac = fVar199 - fVar182;
        auVar139._0_4_ =
             (fVar73 * (fVar196 + fVar176) - (local_1108 + fVar146) * local_fb8) * fVar11 +
             ((fVar164 + fVar190) * local_fb8 - (fVar196 + fVar176) * fVar177) * fVar56 +
             (fVar177 * (local_1108 + fVar146) - (fVar164 + fVar190) * fVar73) * fVar72;
        auVar139._4_4_ =
             (fVar93 * (fVar197 + fVar178) - (fStack_1104 + fVar156) * fStack_fb4) * fVar11 +
             ((fVar170 + fVar193) * fStack_fb4 - (fVar197 + fVar178) * fVar179) * fVar56 +
             (fVar179 * (fStack_1104 + fVar156) - (fVar170 + fVar193) * fVar93) * fVar72;
        auVar139._8_4_ =
             (fVar94 * (fVar198 + fVar180) - (fStack_1100 + fVar157) * fStack_fb0) * fVar11 +
             ((fVar172 + fVar194) * fStack_fb0 - (fVar198 + fVar180) * fVar181) * fVar56 +
             (fVar181 * (fStack_1100 + fVar157) - (fVar172 + fVar194) * fVar94) * fVar72;
        auVar139._12_4_ =
             (fVar95 * (fVar199 + fVar182) - (fStack_10fc + fVar158) * fStack_fac) * fVar11 +
             ((fVar174 + fVar195) * fStack_fac - (fVar199 + fVar182) * fVar183) * fVar56 +
             (fVar183 * (fStack_10fc + fVar158) - (fVar174 + fVar195) * fVar95) * fVar72;
        fVar200 = fVar190 - fVar213;
        fVar203 = fVar193 - fVar217;
        fVar205 = fVar194 - fVar221;
        fVar207 = fVar195 - fVar225;
        fVar165 = fVar146 - fVar184;
        fVar171 = fVar156 - fVar187;
        fVar173 = fVar157 - fVar188;
        fVar175 = fVar158 - fVar189;
        fVar57 = fVar176 - fVar159;
        fVar69 = fVar178 - fVar161;
        fVar70 = fVar180 - fVar162;
        fVar71 = fVar182 - fVar163;
        auVar99._0_4_ =
             (fVar165 * (fVar159 + fVar176) - (fVar184 + fVar146) * fVar57) * fVar11 +
             ((fVar213 + fVar190) * fVar57 - (fVar159 + fVar176) * fVar200) * fVar56 +
             (fVar200 * (fVar184 + fVar146) - (fVar213 + fVar190) * fVar165) * fVar72;
        auVar99._4_4_ =
             (fVar171 * (fVar161 + fVar178) - (fVar187 + fVar156) * fVar69) * fVar11 +
             ((fVar217 + fVar193) * fVar69 - (fVar161 + fVar178) * fVar203) * fVar56 +
             (fVar203 * (fVar187 + fVar156) - (fVar217 + fVar193) * fVar171) * fVar72;
        auVar99._8_4_ =
             (fVar173 * (fVar162 + fVar180) - (fVar188 + fVar157) * fVar70) * fVar11 +
             ((fVar221 + fVar194) * fVar70 - (fVar162 + fVar180) * fVar205) * fVar56 +
             (fVar205 * (fVar188 + fVar157) - (fVar221 + fVar194) * fVar173) * fVar72;
        auVar99._12_4_ =
             (fVar175 * (fVar163 + fVar182) - (fVar189 + fVar158) * fVar71) * fVar11 +
             ((fVar225 + fVar195) * fVar71 - (fVar163 + fVar182) * fVar207) * fVar56 +
             (fVar207 * (fVar189 + fVar158) - (fVar225 + fVar195) * fVar175) * fVar72;
        fVar156 = fVar125 + auVar139._0_4_ + auVar99._0_4_;
        fVar159 = fVar135 + auVar139._4_4_ + auVar99._4_4_;
        fVar161 = aVar131._8_4_ + auVar139._8_4_ + auVar99._8_4_;
        fVar146 = aVar131._12_4_ + auVar139._12_4_ + auVar99._12_4_;
        auVar149._8_4_ = aVar131._8_4_;
        auVar149._0_8_ = aVar131._0_8_;
        auVar149._12_4_ = aVar131._12_4_;
        auVar150 = minps(auVar149,auVar139);
        auVar150 = minps(auVar150,auVar99);
        auVar166._8_4_ = aVar131._8_4_;
        auVar166._0_8_ = aVar131._0_8_;
        auVar166._12_4_ = aVar131._12_4_;
        auVar96 = maxps(auVar166,auVar139);
        auVar96 = maxps(auVar96,auVar99);
        local_fc8 = ABS(fVar156);
        fStack_fc4 = ABS(fVar159);
        fStack_fc0 = ABS(fVar161);
        fStack_fbc = ABS(fVar146);
        auVar167._4_4_ = -(uint)(auVar96._4_4_ <= fStack_fc4 * 1.1920929e-07);
        auVar167._0_4_ = -(uint)(auVar96._0_4_ <= local_fc8 * 1.1920929e-07);
        auVar167._8_4_ = -(uint)(auVar96._8_4_ <= fStack_fc0 * 1.1920929e-07);
        auVar167._12_4_ = -(uint)(auVar96._12_4_ <= fStack_fbc * 1.1920929e-07);
        auVar151._4_4_ = -(uint)(-(fStack_fc4 * 1.1920929e-07) <= auVar150._4_4_);
        auVar151._0_4_ = -(uint)(-(local_fc8 * 1.1920929e-07) <= auVar150._0_4_);
        auVar151._8_4_ = -(uint)(-(fStack_fc0 * 1.1920929e-07) <= auVar150._8_4_);
        auVar151._12_4_ = -(uint)(-(fStack_fbc * 1.1920929e-07) <= auVar150._12_4_);
        auVar167 = auVar167 | auVar151;
        iVar28 = movmskps((int)local_1220,auVar167);
        root.ptr = (size_t)local_10d8;
        local_1218 = uVar34;
        local_1210 = uVar42;
        if (iVar28 != 0) {
          uVar43 = -(uint)(ABS(fVar165 * local_fb8) <= ABS(fVar73 * local_f98));
          uVar46 = -(uint)(ABS(fVar171 * fStack_fb4) <= ABS(fVar93 * fStack_f94));
          uVar49 = -(uint)(ABS(fVar173 * fStack_fb0) <= ABS(fVar94 * fStack_f90));
          uVar52 = -(uint)(ABS(fVar175 * fStack_fac) <= ABS(fVar95 * fStack_f8c));
          uVar44 = -(uint)(ABS(fVar177 * fVar57) <= ABS(local_f88 * local_fb8));
          uVar47 = -(uint)(ABS(fVar179 * fVar69) <= ABS(fStack_f84 * fStack_fb4));
          uVar50 = -(uint)(ABS(fVar181 * fVar70) <= ABS(fStack_f80 * fStack_fb0));
          uVar53 = -(uint)(ABS(fVar183 * fVar71) <= ABS(fStack_f7c * fStack_fac));
          uVar45 = -(uint)(ABS(fVar200 * fVar73) <= ABS(fVar177 * local_fa8));
          uVar48 = -(uint)(ABS(fVar203 * fVar93) <= ABS(fVar179 * fStack_fa4));
          uVar51 = -(uint)(ABS(fVar205 * fVar94) <= ABS(fVar181 * fStack_fa0));
          uVar54 = -(uint)(ABS(fVar207 * fVar95) <= ABS(fVar183 * fStack_f9c));
          fVar157 = (float)(~uVar43 & (uint)(local_fa8 * local_fb8 - fVar73 * local_f98) |
                           (uint)(fVar73 * fVar57 - fVar165 * local_fb8) & uVar43);
          fVar158 = (float)(~uVar46 & (uint)(fStack_fa4 * fStack_fb4 - fVar93 * fStack_f94) |
                           (uint)(fVar93 * fVar69 - fVar171 * fStack_fb4) & uVar46);
          fVar176 = (float)(~uVar49 & (uint)(fStack_fa0 * fStack_fb0 - fVar94 * fStack_f90) |
                           (uint)(fVar94 * fVar70 - fVar173 * fStack_fb0) & uVar49);
          fVar178 = (float)(~uVar52 & (uint)(fStack_f9c * fStack_fac - fVar95 * fStack_f8c) |
                           (uint)(fVar95 * fVar71 - fVar175 * fStack_fac) & uVar52);
          auVar202._0_4_ = (uint)(fVar200 * local_fb8 - fVar177 * fVar57) & uVar44;
          auVar202._4_4_ = (uint)(fVar203 * fStack_fb4 - fVar179 * fVar69) & uVar47;
          auVar202._8_4_ = (uint)(fVar205 * fStack_fb0 - fVar181 * fVar70) & uVar50;
          auVar202._12_4_ = (uint)(fVar207 * fStack_fac - fVar183 * fVar71) & uVar53;
          auVar100._0_4_ = ~uVar44 & (uint)(local_f98 * fVar177 - local_f88 * local_fb8);
          auVar100._4_4_ = ~uVar47 & (uint)(fStack_f94 * fVar179 - fStack_f84 * fStack_fb4);
          auVar100._8_4_ = ~uVar50 & (uint)(fStack_f90 * fVar181 - fStack_f80 * fStack_fb0);
          auVar100._12_4_ = ~uVar53 & (uint)(fStack_f8c * fVar183 - fStack_f7c * fStack_fac);
          auVar100 = auVar100 | auVar202;
          fVar57 = (float)(~uVar45 & (uint)(local_f88 * fVar73 - fVar177 * local_fa8) |
                          (uint)(fVar177 * fVar165 - fVar200 * fVar73) & uVar45);
          fVar69 = (float)(~uVar48 & (uint)(fStack_f84 * fVar93 - fVar179 * fStack_fa4) |
                          (uint)(fVar179 * fVar171 - fVar203 * fVar93) & uVar48);
          fVar70 = (float)(~uVar51 & (uint)(fStack_f80 * fVar94 - fVar181 * fStack_fa0) |
                          (uint)(fVar181 * fVar173 - fVar205 * fVar94) & uVar51);
          fVar71 = (float)(~uVar54 & (uint)(fStack_f7c * fVar95 - fVar183 * fStack_f9c) |
                          (uint)(fVar183 * fVar175 - fVar207 * fVar95) & uVar54);
          fVar171 = fVar11 * fVar157 + fVar56 * auVar100._0_4_ + fVar72 * fVar57;
          fVar173 = fVar11 * fVar158 + fVar56 * auVar100._4_4_ + fVar72 * fVar69;
          fVar175 = fVar11 * fVar176 + fVar56 * auVar100._8_4_ + fVar72 * fVar70;
          fVar177 = fVar11 * fVar178 + fVar56 * auVar100._12_4_ + fVar72 * fVar71;
          fVar171 = fVar171 + fVar171;
          fVar173 = fVar173 + fVar173;
          fVar175 = fVar175 + fVar175;
          fVar177 = fVar177 + fVar177;
          auVar117._0_4_ = local_1108 * auVar100._0_4_ + fVar196 * fVar57;
          auVar117._4_4_ = fStack_1104 * auVar100._4_4_ + fVar197 * fVar69;
          auVar117._8_4_ = fStack_1100 * auVar100._8_4_ + fVar198 * fVar70;
          auVar117._12_4_ = fStack_10fc * auVar100._12_4_ + fVar199 * fVar71;
          fVar94 = fVar164 * fVar157 + auVar117._0_4_;
          fVar95 = fVar170 * fVar158 + auVar117._4_4_;
          fVar162 = fVar172 * fVar176 + auVar117._8_4_;
          fVar165 = fVar174 * fVar178 + auVar117._12_4_;
          auVar23._4_4_ = fVar173;
          auVar23._0_4_ = fVar171;
          auVar23._8_4_ = fVar175;
          auVar23._12_4_ = fVar177;
          auVar150 = rcpps(auVar117,auVar23);
          fVar56 = auVar150._0_4_;
          fVar72 = auVar150._4_4_;
          fVar73 = auVar150._8_4_;
          fVar93 = auVar150._12_4_;
          fVar94 = ((1.0 - fVar171 * fVar56) * fVar56 + fVar56) * (fVar94 + fVar94);
          fVar95 = ((1.0 - fVar173 * fVar72) * fVar72 + fVar72) * (fVar95 + fVar95);
          fVar73 = ((1.0 - fVar175 * fVar73) * fVar73 + fVar73) * (fVar162 + fVar162);
          fVar93 = ((1.0 - fVar177 * fVar93) * fVar93 + fVar93) * (fVar165 + fVar165);
          fVar72 = *(float *)(ray + k * 4 + 0x80);
          fVar56 = *(float *)(ray + k * 4 + 0x30);
          auVar140._0_4_ = -(uint)(fVar94 <= fVar72 && fVar56 <= fVar94) & auVar167._0_4_;
          auVar140._4_4_ = -(uint)(fVar95 <= fVar72 && fVar56 <= fVar95) & auVar167._4_4_;
          auVar140._8_4_ = -(uint)(fVar73 <= fVar72 && fVar56 <= fVar73) & auVar167._8_4_;
          auVar140._12_4_ = -(uint)(fVar93 <= fVar72 && fVar56 <= fVar93) & auVar167._12_4_;
          iVar28 = movmskps(iVar28,auVar140);
          if (iVar28 != 0) {
            aVar141._0_4_ = auVar140._0_4_ & -(uint)(fVar171 != 0.0);
            aVar141._4_4_ = auVar140._4_4_ & -(uint)(fVar173 != 0.0);
            aVar141._8_4_ = auVar140._8_4_ & -(uint)(fVar175 != 0.0);
            aVar141._12_4_ = auVar140._12_4_ & -(uint)(fVar177 != 0.0);
            iVar28 = movmskps(iVar28,(undefined1  [16])aVar141);
            if (iVar28 != 0) {
              uVar43 = *(uint *)&local_10d8->userPtr;
              uStack_12e0._0_4_ = *(float *)((long)&local_10d8->userPtr + 4);
              tNear.field_0 = aVar131;
              local_1148[0] = fVar94;
              local_1148[1] = fVar95;
              local_1148[2] = fVar73;
              local_1148[3] = fVar93;
              local_1138._4_4_ = fVar158;
              local_1138._0_4_ = fVar157;
              fStack_1130 = fVar176;
              fStack_112c = fVar178;
              _local_1128 = auVar100;
              local_1118[0] = fVar57;
              local_1118[1] = fVar69;
              local_1118[2] = fVar70;
              local_1118[3] = fVar71;
              pGVar14 = (context->scene->geometries).items[uVar43].ptr;
              root.ptr = (size_t)(ulong)*(uint *)(ray + k * 4 + 0x90);
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                uVar44 = *(uint *)(lVar32 + 0x30);
                pfVar8 = local_1220 + uVar34;
                fVar56 = *pfVar8;
                fVar57 = pfVar8[1];
                uVar45 = *(uint *)(lVar32 + 0x34);
                fVar69 = pfVar8[2];
                if (uVar34 == 2) {
                  uVar45 = uVar44;
                  fVar69 = fVar57;
                }
                auVar22._4_4_ = fVar159;
                auVar22._0_4_ = fVar156;
                auVar22._8_4_ = fVar161;
                auVar22._12_4_ = fVar146;
                auVar150 = rcpps((undefined1  [16])aVar131,auVar22);
                fVar70 = auVar150._0_4_;
                fVar71 = auVar150._4_4_;
                fVar162 = auVar150._8_4_;
                fVar165 = auVar150._12_4_;
                fVar70 = (float)(-(uint)(1e-18 <= local_fc8) &
                                (uint)(((float)DAT_01f7ba10 - fVar156 * fVar70) * fVar70 + fVar70));
                fVar71 = (float)(-(uint)(1e-18 <= fStack_fc4) &
                                (uint)((DAT_01f7ba10._4_4_ - fVar159 * fVar71) * fVar71 + fVar71));
                fVar156 = (float)(-(uint)(1e-18 <= fStack_fc0) &
                                 (uint)((DAT_01f7ba10._8_4_ - fVar161 * fVar162) * fVar162 + fVar162
                                       ));
                fVar159 = (float)(-(uint)(1e-18 <= fStack_fbc) &
                                 (uint)((DAT_01f7ba10._12_4_ - fVar146 * fVar165) * fVar165 +
                                       fVar165));
                auVar191._0_4_ = fVar125 * fVar70;
                auVar191._4_4_ = fVar135 * fVar71;
                auVar191._8_4_ = aVar131._8_4_ * fVar156;
                auVar191._12_4_ = aVar131._12_4_ * fVar159;
                auVar96 = minps(auVar191,_DAT_01f7ba10);
                auVar78._0_4_ = auVar139._0_4_ * fVar70;
                auVar78._4_4_ = auVar139._4_4_ * fVar71;
                auVar78._8_4_ = auVar139._8_4_ * fVar156;
                auVar78._12_4_ = auVar139._12_4_ * fVar159;
                auVar150 = minps(auVar78,_DAT_01f7ba10);
                fVar162 = auVar96._0_4_;
                fVar165 = auVar96._4_4_;
                fVar171 = auVar96._8_4_;
                fVar173 = auVar96._12_4_;
                fVar70 = auVar150._0_4_;
                fVar71 = auVar150._4_4_;
                fVar125 = auVar150._8_4_;
                fVar135 = auVar150._12_4_;
                fVar156 = ((float)DAT_01f7ba10 - fVar162) - fVar70;
                fVar159 = (DAT_01f7ba10._4_4_ - fVar165) - fVar71;
                fVar161 = (DAT_01f7ba10._8_4_ - fVar171) - fVar125;
                fVar146 = (DAT_01f7ba10._12_4_ - fVar173) - fVar135;
                local_1168[0] =
                     (float)((uint)*local_1220 & 0xffff) * 0.00012207031 * fVar156 +
                     (float)((uint)fVar56 & 0xffff) * 0.00012207031 * fVar70 +
                     (float)(uVar44 & 0xffff) * 0.00012207031 * fVar162;
                local_1168[1] =
                     (float)((uint)fVar56 & 0xffff) * 0.00012207031 * fVar159 +
                     (float)((uint)fVar57 & 0xffff) * 0.00012207031 * fVar71 +
                     (float)(uVar44 & 0xffff) * 0.00012207031 * fVar165;
                local_1168[2] =
                     (float)(uVar44 & 0xffff) * 0.00012207031 * fVar161 +
                     (float)((uint)fVar57 & 0xffff) * 0.00012207031 * fVar125 +
                     (float)(uVar45 & 0xffff) * 0.00012207031 * fVar171;
                local_1168[3] =
                     (float)((uint)fVar57 & 0xffff) * 0.00012207031 * fVar146 +
                     (float)((uint)fVar69 & 0xffff) * 0.00012207031 * fVar135 +
                     (float)(uVar45 & 0xffff) * 0.00012207031 * fVar173;
                local_1158[0] =
                     fVar156 * (float)((uint)*local_1220 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar56 >> 0x10) * 0.00012207031 * fVar70 +
                     (float)(uVar44 >> 0x10) * 0.00012207031 * fVar162;
                local_1158[1] =
                     fVar159 * (float)((uint)fVar56 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar57 >> 0x10) * 0.00012207031 * fVar71 +
                     (float)(uVar44 >> 0x10) * 0.00012207031 * fVar165;
                local_1158[2] =
                     fVar161 * (float)(uVar44 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar57 >> 0x10) * 0.00012207031 * fVar125 +
                     (float)(uVar45 >> 0x10) * 0.00012207031 * fVar171;
                local_1158[3] =
                     fVar146 * (float)((uint)fVar57 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar69 >> 0x10) * 0.00012207031 * fVar135 +
                     (float)(uVar45 >> 0x10) * 0.00012207031 * fVar173;
                auVar58._0_4_ = (uint)fVar94 & aVar141._0_4_;
                auVar58._4_4_ = (uint)fVar95 & aVar141._4_4_;
                auVar58._8_4_ = (uint)fVar73 & aVar141._8_4_;
                auVar58._12_4_ = (uint)fVar93 & aVar141._12_4_;
                auVar79._0_8_ = CONCAT44(~aVar141._4_4_,~aVar141._0_4_) & 0x7f8000007f800000;
                auVar79._8_4_ = ~aVar141._8_4_ & 0x7f800000;
                auVar79._12_4_ = ~aVar141._12_4_ & 0x7f800000;
                auVar79 = auVar79 | auVar58;
                auVar101._4_4_ = auVar79._0_4_;
                auVar101._0_4_ = auVar79._4_4_;
                auVar101._8_4_ = auVar79._12_4_;
                auVar101._12_4_ = auVar79._8_4_;
                auVar150 = minps(auVar101,auVar79);
                auVar59._0_8_ = auVar150._8_8_;
                auVar59._8_4_ = auVar150._0_4_;
                auVar59._12_4_ = auVar150._4_4_;
                auVar150 = minps(auVar59,auVar150);
                uVar48 = -(uint)(auVar150._0_4_ == auVar79._0_4_);
                uVar49 = -(uint)(auVar150._4_4_ == auVar79._4_4_);
                uVar50 = -(uint)(auVar150._8_4_ == auVar79._8_4_);
                uVar51 = -(uint)(auVar150._12_4_ == auVar79._12_4_);
                auVar80._0_4_ = uVar48 & aVar141._0_4_;
                auVar80._4_4_ = uVar49 & aVar141._4_4_;
                auVar80._8_4_ = uVar50 & aVar141._8_4_;
                auVar80._12_4_ = uVar51 & aVar141._12_4_;
                iVar28 = movmskps((int)local_1220,auVar80);
                uVar44 = 0xffffffff;
                uVar45 = 0xffffffff;
                uVar46 = 0xffffffff;
                uVar47 = 0xffffffff;
                if (iVar28 != 0) {
                  uVar44 = uVar48;
                  uVar45 = uVar49;
                  uVar46 = uVar50;
                  uVar47 = uVar51;
                }
                auVar142._0_4_ = aVar141._0_4_ & uVar44;
                auVar142._4_4_ = aVar141._4_4_ & uVar45;
                auVar142._8_4_ = aVar141._8_4_ & uVar46;
                auVar142._12_4_ = aVar141._12_4_ & uVar47;
                uVar37 = movmskps(iVar28,auVar142);
                uVar31 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar37);
                lVar32 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                  }
                }
                valid.field_0 = aVar141;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar56 = local_1168[lVar32];
                  fVar72 = local_1158[lVar32];
                  uVar37 = *(undefined4 *)(local_1138 + lVar32 * 4);
                  fVar57 = local_1118[lVar32 + -4];
                  fVar69 = local_1118[lVar32];
                  *(float *)(ray + k * 4 + 0x80) = local_1148[lVar32];
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar37;
                  *(float *)(ray + k * 4 + 0xd0) = fVar57;
                  *(float *)(ray + k * 4 + 0xe0) = fVar69;
                  *(float *)(ray + k * 4 + 0xf0) = fVar56;
                  *(float *)(ray + k * 4 + 0x100) = fVar72;
                  *(float *)(ray + k * 4 + 0x110) = (float)uStack_12e0;
                  *(uint *)(ray + k * 4 + 0x120) = uVar43;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  root.ptr = (size_t)pGVar14;
                }
                else {
                  local_12e8 = CONCAT44((float)uStack_12e0,(float)uStack_12e0);
                  uStack_12e0._4_4_ = (float)uStack_12e0;
                  auVar150 = *(undefined1 (*) [16])(mm_lookupmask_ps + lVar29);
                  while( true ) {
                    local_1098 = local_1168[lVar32];
                    fVar56 = local_1158[lVar32];
                    *(float *)(ray + k * 4 + 0x80) = local_1148[lVar32];
                    args.context = context->user;
                    local_1088._4_4_ = fVar56;
                    local_1088._0_4_ = fVar56;
                    local_1088._8_4_ = fVar56;
                    local_1088._12_4_ = fVar56;
                    local_10c8 = *(undefined4 *)(local_1138 + lVar32 * 4);
                    fVar56 = local_1118[lVar32 + -4];
                    fVar57 = local_1118[lVar32];
                    local_10b8._4_4_ = fVar56;
                    local_10b8._0_4_ = fVar56;
                    local_10b8._8_4_ = fVar56;
                    local_10b8._12_4_ = fVar56;
                    local_10a8._4_4_ = fVar57;
                    local_10a8._0_4_ = fVar57;
                    local_10a8._8_4_ = fVar57;
                    local_10a8._12_4_ = fVar57;
                    uStack_10c4 = local_10c8;
                    uStack_10c0 = local_10c8;
                    uStack_10bc = local_10c8;
                    fStack_1094 = local_1098;
                    fStack_1090 = local_1098;
                    fStack_108c = local_1098;
                    local_1078 = local_12e8;
                    uStack_1070 = uStack_12e0;
                    local_1068 = CONCAT44(uVar43,uVar43);
                    uStack_1060 = CONCAT44(uVar43,uVar43);
                    local_1058 = (args.context)->instID[0];
                    uStack_1054 = local_1058;
                    uStack_1050 = local_1058;
                    uStack_104c = local_1058;
                    local_1048 = (args.context)->instPrimID[0];
                    uStack_1044 = local_1048;
                    uStack_1040 = local_1048;
                    uStack_103c = local_1048;
                    args.valid = (int *)local_1238;
                    args.geometryUserPtr = pGVar14->userPtr;
                    args.hit = (RTCHitN *)&local_10c8;
                    args.N = 4;
                    p_Var16 = pGVar14->intersectionFilterN;
                    auVar228._8_8_ = pGVar14;
                    auVar228._0_8_ = p_Var16;
                    local_1238 = auVar150;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var16 != (RTCFilterFunctionN)0x0) {
                      auVar228 = (*p_Var16)(&args);
                    }
                    root.ptr = auVar228._8_8_;
                    auVar83._0_4_ = -(uint)(local_1238._0_4_ == 0);
                    auVar83._4_4_ = -(uint)(local_1238._4_4_ == 0);
                    auVar83._8_4_ = -(uint)(local_1238._8_4_ == 0);
                    auVar83._12_4_ = -(uint)(local_1238._12_4_ == 0);
                    uVar44 = movmskps(auVar228._0_4_,auVar83);
                    pRVar33 = (RTCRayN *)(ulong)(uVar44 ^ 0xf);
                    if ((uVar44 ^ 0xf) == 0) {
                      auVar83 = auVar83 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var16 = context->args->filter;
                      auVar25._8_8_ = root.ptr;
                      auVar25._0_8_ = p_Var16;
                      auVar229._8_8_ = root.ptr;
                      auVar229._0_8_ = p_Var16;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (auVar229 = auVar25, ((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar229 = (*p_Var16)(&args);
                      }
                      root.ptr = auVar229._8_8_;
                      auVar65._0_4_ = -(uint)(local_1238._0_4_ == 0);
                      auVar65._4_4_ = -(uint)(local_1238._4_4_ == 0);
                      auVar65._8_4_ = -(uint)(local_1238._8_4_ == 0);
                      auVar65._12_4_ = -(uint)(local_1238._12_4_ == 0);
                      auVar83 = auVar65 ^ _DAT_01f7ae20;
                      uVar44 = movmskps(auVar229._0_4_,auVar65);
                      pRVar33 = (RTCRayN *)(ulong)(uVar44 ^ 0xf);
                      if ((uVar44 ^ 0xf) != 0) {
                        auVar104._0_4_ = *(uint *)(args.ray + 0xc0) & auVar65._0_4_;
                        auVar104._4_4_ = *(uint *)(args.ray + 0xc4) & auVar65._4_4_;
                        auVar104._8_4_ = *(uint *)(args.ray + 200) & auVar65._8_4_;
                        auVar104._12_4_ = *(uint *)(args.ray + 0xcc) & auVar65._12_4_;
                        auVar154._0_4_ = ~auVar65._0_4_ & *(uint *)args.hit;
                        auVar154._4_4_ = ~auVar65._4_4_ & *(uint *)(args.hit + 4);
                        auVar154._8_4_ = ~auVar65._8_4_ & *(uint *)(args.hit + 8);
                        auVar154._12_4_ = ~auVar65._12_4_ & *(uint *)(args.hit + 0xc);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar154 | auVar104;
                        uVar44 = *(uint *)(args.hit + 0x14);
                        uVar45 = *(uint *)(args.hit + 0x18);
                        uVar46 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar65._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar65._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar65._4_4_ & uVar44 | *(uint *)(args.ray + 0xd4) & auVar65._4_4_;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar65._8_4_ & uVar45 | *(uint *)(args.ray + 0xd8) & auVar65._8_4_;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar65._12_4_ & uVar46 | *(uint *)(args.ray + 0xdc) & auVar65._12_4_;
                        auVar133._0_4_ = *(uint *)(args.ray + 0xe0) & auVar65._0_4_;
                        auVar133._4_4_ = *(uint *)(args.ray + 0xe4) & auVar65._4_4_;
                        auVar133._8_4_ = *(uint *)(args.ray + 0xe8) & auVar65._8_4_;
                        auVar133._12_4_ = *(uint *)(args.ray + 0xec) & auVar65._12_4_;
                        auVar105._0_4_ = ~auVar65._0_4_ & *(uint *)(args.hit + 0x20);
                        auVar105._4_4_ = ~auVar65._4_4_ & *(uint *)(args.hit + 0x24);
                        auVar105._8_4_ = ~auVar65._8_4_ & *(uint *)(args.hit + 0x28);
                        auVar105._12_4_ = ~auVar65._12_4_ & *(uint *)(args.hit + 0x2c);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar105 | auVar133;
                        auVar144._0_4_ = *(uint *)(args.ray + 0xf0) & auVar65._0_4_;
                        auVar144._4_4_ = *(uint *)(args.ray + 0xf4) & auVar65._4_4_;
                        auVar144._8_4_ = *(uint *)(args.ray + 0xf8) & auVar65._8_4_;
                        auVar144._12_4_ = *(uint *)(args.ray + 0xfc) & auVar65._12_4_;
                        auVar106._0_4_ = ~auVar65._0_4_ & *(uint *)(args.hit + 0x30);
                        auVar106._4_4_ = ~auVar65._4_4_ & *(uint *)(args.hit + 0x34);
                        auVar106._8_4_ = ~auVar65._8_4_ & *(uint *)(args.hit + 0x38);
                        auVar106._12_4_ = ~auVar65._12_4_ & *(uint *)(args.hit + 0x3c);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar106 | auVar144;
                        uVar44 = *(uint *)(args.hit + 0x44);
                        uVar45 = *(uint *)(args.hit + 0x48);
                        uVar46 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar65._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar65._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar65._4_4_ & uVar44 | *(uint *)(args.ray + 0x104) & auVar65._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar65._8_4_ & uVar45 | *(uint *)(args.ray + 0x108) & auVar65._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar65._12_4_ & uVar46 | *(uint *)(args.ray + 0x10c) & auVar65._12_4_
                        ;
                        uVar44 = *(uint *)(args.hit + 0x54);
                        uVar45 = *(uint *)(args.hit + 0x58);
                        uVar46 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar65._0_4_ |
                             ~auVar65._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar65._4_4_ | ~auVar65._4_4_ & uVar44;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar65._8_4_ | ~auVar65._8_4_ & uVar45;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar65._12_4_ | ~auVar65._12_4_ & uVar46
                        ;
                        uVar44 = *(uint *)(args.hit + 100);
                        uVar45 = *(uint *)(args.hit + 0x68);
                        uVar46 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar65._0_4_ |
                             ~auVar65._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar65._4_4_ | ~auVar65._4_4_ & uVar44;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar65._8_4_ | ~auVar65._8_4_ & uVar45;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar65._12_4_ | ~auVar65._12_4_ & uVar46;
                        auVar107._0_4_ = *(uint *)(args.ray + 0x130) & auVar65._0_4_;
                        auVar107._4_4_ = *(uint *)(args.ray + 0x134) & auVar65._4_4_;
                        auVar107._8_4_ = *(uint *)(args.ray + 0x138) & auVar65._8_4_;
                        auVar107._12_4_ = *(uint *)(args.ray + 0x13c) & auVar65._12_4_;
                        auVar121._0_4_ = ~auVar65._0_4_ & *(uint *)(args.hit + 0x70);
                        auVar121._4_4_ = ~auVar65._4_4_ & *(uint *)(args.hit + 0x74);
                        auVar121._8_4_ = ~auVar65._8_4_ & *(uint *)(args.hit + 0x78);
                        auVar121._12_4_ = ~auVar65._12_4_ & *(uint *)(args.hit + 0x7c);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar121 | auVar107;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar65 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar65;
                        pRVar33 = args.ray;
                      }
                    }
                    auVar84._0_4_ = auVar83._0_4_ << 0x1f;
                    auVar84._4_4_ = auVar83._4_4_ << 0x1f;
                    auVar84._8_4_ = auVar83._8_4_ << 0x1f;
                    auVar84._12_4_ = auVar83._12_4_ << 0x1f;
                    iVar28 = movmskps((int)pRVar33,auVar84);
                    if (iVar28 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar72;
                    }
                    else {
                      fVar72 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1238 + lVar32 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(fVar94 <= fVar72) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(fVar95 <= fVar72) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(fVar73 <= fVar72) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(fVar93 <= fVar72) & valid.field_0.i[3];
                    iVar28 = movmskps(iVar28,(undefined1  [16])valid.field_0);
                    if (iVar28 == 0) break;
                    auVar85._0_4_ = valid.field_0.i[0] & (uint)fVar94;
                    auVar85._4_4_ = valid.field_0.i[1] & (uint)fVar95;
                    auVar85._8_4_ = valid.field_0.i[2] & (uint)fVar73;
                    auVar85._12_4_ = valid.field_0.i[3] & (uint)fVar93;
                    auVar108._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar108._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar108._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar108 = auVar108 | auVar85;
                    auVar122._4_4_ = auVar108._0_4_;
                    auVar122._0_4_ = auVar108._4_4_;
                    auVar122._8_4_ = auVar108._12_4_;
                    auVar122._12_4_ = auVar108._8_4_;
                    auVar96 = minps(auVar122,auVar108);
                    auVar86._0_8_ = auVar96._8_8_;
                    auVar86._8_4_ = auVar96._0_4_;
                    auVar86._12_4_ = auVar96._4_4_;
                    auVar96 = minps(auVar86,auVar96);
                    auVar87._0_8_ =
                         CONCAT44(-(uint)(auVar96._4_4_ == auVar108._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar96._0_4_ == auVar108._0_4_) & valid.field_0.i[0]);
                    auVar87._8_4_ = -(uint)(auVar96._8_4_ == auVar108._8_4_) & valid.field_0.i[2];
                    auVar87._12_4_ = -(uint)(auVar96._12_4_ == auVar108._12_4_) & valid.field_0.i[3]
                    ;
                    iVar28 = movmskps(iVar28,auVar87);
                    aVar66 = valid.field_0;
                    if (iVar28 != 0) {
                      aVar66.i[2] = auVar87._8_4_;
                      aVar66._0_8_ = auVar87._0_8_;
                      aVar66.i[3] = auVar87._12_4_;
                    }
                    uVar37 = movmskps(iVar28,(undefined1  [16])aVar66);
                    uVar31 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar37);
                    lVar32 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (2 < uVar36) {
          local_10f8 = local_10f8 + uVar34 * 4;
          pfVar35 = (float *)(local_10f8 + 0x2c);
          pGVar15 = (GridSOA *)(local_1228->super_RefCount)._vptr_RefCount;
          uVar31 = (ulong)pGVar15->dim_offset;
          uVar43 = pGVar15->gridBytes >> 2;
          pfVar8 = pfVar35 + uVar31;
          pfVar10 = pfVar35 + uVar31 * 2;
          fVar56 = *(float *)(local_10f8 + 0x30);
          pfVar9 = pfVar35 + uVar34;
          fVar72 = pfVar9[1];
          if (uVar34 == 2) {
            local_12b8._0_4_ = *pfVar8;
            fVar57 = pfVar8[1];
            fVar69 = pfVar8[2];
            fVar70 = pfVar8[3];
            local_12a8 = *pfVar10;
            fVar71 = pfVar10[1];
            fStack_12a4 = pfVar10[2];
            fStack_129c = pfVar10[3];
            uStack_12e0._0_4_ = fStack_129c;
            local_12e8 = *(undefined8 *)(pfVar10 + 2);
            uStack_12e0._4_4_ = fStack_129c;
            uVar39 = (ulong)(uVar43 << 2);
            fVar73 = *(float *)((long)pfVar35 + uVar39);
            fVar93 = ((float *)((long)pfVar35 + uVar39))[1];
            fVar94 = *(float *)((long)pfVar35 + uVar39 + 8);
            fVar95 = *(float *)((long)pfVar35 + uVar39 + 0xc);
            fVar125 = *(float *)((long)pfVar8 + uVar39);
            fVar135 = ((float *)((long)pfVar8 + uVar39))[1];
            fVar156 = *(float *)((long)pfVar8 + uVar39 + 8);
            fVar159 = *(float *)((long)pfVar8 + uVar39 + 0xc);
            fVar161 = *(float *)((long)pfVar10 + uVar39);
            fVar146 = ((float *)((long)pfVar10 + uVar39))[1];
            fVar162 = *(float *)((long)pfVar10 + uVar39 + 8);
            fVar165 = *(float *)((long)pfVar10 + uVar39 + 0xc);
            fVar171 = fVar70;
            fVar173 = fVar95;
            fVar175 = fVar159;
            fVar177 = fVar146;
            fVar179 = fVar165;
            fVar157 = fVar93;
            fVar158 = fVar71;
            fVar176 = fVar135;
            fVar181 = fVar56;
            fVar178 = fVar57;
            fStack_12cc = fVar72;
          }
          else {
            local_12b8._0_4_ = *pfVar8;
            fVar57 = pfVar8[1];
            pfVar1 = pfVar8 + uVar34;
            fVar69 = *pfVar1;
            fVar70 = pfVar1[1];
            local_12a8 = *pfVar10;
            fVar71 = pfVar10[1];
            pfVar2 = pfVar10 + uVar34;
            fStack_12a4 = *pfVar2;
            fStack_129c = pfVar2[1];
            uStack_12e0._0_4_ = fStack_129c;
            local_12e8 = *(undefined8 *)pfVar2;
            uStack_12e0._4_4_ = pfVar2[2];
            uVar39 = (ulong)(uVar43 << 2);
            pfVar2 = (float *)((long)pfVar35 + uVar39);
            fVar73 = *pfVar2;
            fVar93 = pfVar2[1];
            pfVar3 = (float *)((long)pfVar35 + uVar34 * 4 + uVar39);
            fVar94 = *pfVar3;
            fVar95 = pfVar3[1];
            pfVar4 = (float *)((long)pfVar8 + uVar39);
            fVar125 = *pfVar4;
            fVar135 = pfVar4[1];
            pfVar5 = (float *)((long)pfVar8 + uVar34 * 4 + uVar39);
            fVar156 = *pfVar5;
            fVar159 = pfVar5[1];
            pfVar6 = (float *)((long)pfVar10 + uVar39);
            fVar161 = *pfVar6;
            fVar146 = pfVar6[1];
            pfVar7 = (float *)((long)pfVar10 + uVar34 * 4 + uVar39);
            fVar162 = *pfVar7;
            fVar165 = pfVar7[1];
            fVar171 = pfVar1[2];
            fVar173 = pfVar3[2];
            fVar175 = pfVar5[2];
            fVar177 = pfVar6[2];
            fVar179 = pfVar7[2];
            fVar157 = pfVar2[2];
            fVar158 = pfVar10[2];
            fVar176 = pfVar4[2];
            fVar181 = *(float *)(local_10f8 + 0x34);
            fVar178 = pfVar8[2];
            fStack_12cc = pfVar9[2];
          }
          root.ptr = uVar31 * 0xc;
          local_1220 = pfVar35 + uVar31 * 3;
          fVar225 = *(float *)(ray + k * 4);
          fVar189 = *(float *)(ray + k * 4 + 0x10);
          fVar163 = *(float *)(ray + k * 4 + 0x20);
          fVar11 = *(float *)(ray + k * 4 + 0x40);
          fVar164 = *(float *)(ray + k * 4 + 0x50);
          fVar184 = (*pfVar35 * local_10e8 + fVar73 * fVar55) - fVar225;
          fVar187 = (*pfVar9 * fStack_10e4 + fVar94 * fVar55) - fVar225;
          fVar188 = (fVar56 * fStack_10e0 + fVar93 * fVar55) - fVar225;
          fVar190 = (fVar72 * fStack_10dc + fVar95 * fVar55) - fVar225;
          fVar199 = ((float)local_12b8 * local_10e8 + fVar125 * fVar55) - fVar189;
          fVar203 = (fVar69 * fStack_10e4 + fVar156 * fVar55) - fVar189;
          fVar207 = (fVar57 * fStack_10e0 + fVar135 * fVar55) - fVar189;
          fVar217 = (fVar70 * fStack_10dc + fVar159 * fVar55) - fVar189;
          fVar201 = (local_12a8 * local_10e8 + fVar161 * fVar55) - fVar163;
          fVar204 = (fStack_12a4 * fStack_10e4 + fVar162 * fVar55) - fVar163;
          fVar206 = (fVar71 * fStack_10e0 + fVar146 * fVar55) - fVar163;
          fVar208 = (fStack_129c * fStack_10dc + fVar165 * fVar55) - fVar163;
          fVar170 = (fVar56 * local_10e8 + fVar93 * fVar55) - fVar225;
          fVar172 = (fVar56 * fStack_10e4 + fVar93 * fVar55) - fVar225;
          fVar174 = (fVar181 * fStack_10e0 + fVar157 * fVar55) - fVar225;
          fVar180 = (fVar181 * fStack_10dc + fVar157 * fVar55) - fVar225;
          fVar193 = (fVar57 * local_10e8 + fVar135 * fVar55) - fVar189;
          fVar194 = (fVar57 * fStack_10e4 + fVar135 * fVar55) - fVar189;
          fVar195 = (fVar178 * fStack_10e0 + fVar176 * fVar55) - fVar189;
          fVar197 = (fVar178 * fStack_10dc + fVar176 * fVar55) - fVar189;
          fVar161 = (fVar71 * local_10e8 + fVar146 * fVar55) - fVar163;
          fVar157 = (fVar71 * fStack_10e4 + fVar146 * fVar55) - fVar163;
          fVar176 = (fVar158 * fStack_10e0 + fVar177 * fVar55) - fVar163;
          fVar177 = (fVar158 * fStack_10dc + fVar177 * fVar55) - fVar163;
          fVar158 = (*pfVar9 * local_10e8 + fVar94 * fVar55) - fVar225;
          fVar181 = (fVar72 * fStack_10e4 + fVar95 * fVar55) - fVar225;
          fVar178 = (fVar72 * fStack_10e0 + fVar95 * fVar55) - fVar225;
          fVar225 = (fStack_12cc * fStack_10dc + fVar173 * fVar55) - fVar225;
          fVar173 = (fVar69 * local_10e8 + fVar156 * fVar55) - fVar189;
          fVar182 = (fVar70 * fStack_10e4 + fVar159 * fVar55) - fVar189;
          fVar183 = (fVar70 * fStack_10e0 + fVar159 * fVar55) - fVar189;
          fVar189 = (fVar171 * fStack_10dc + fVar175 * fVar55) - fVar189;
          fVar71 = ((float)local_12e8 * local_10e8 + fVar162 * fVar55) - fVar163;
          fVar73 = (local_12e8._4_4_ * fStack_10e4 + fVar165 * fVar55) - fVar163;
          fVar93 = ((float)uStack_12e0 * fStack_10e0 + fVar165 * fVar55) - fVar163;
          fVar163 = (uStack_12e0._4_4_ * fStack_10dc + fVar179 * fVar55) - fVar163;
          fVar146 = fVar158 - fVar184;
          fVar162 = fVar181 - fVar187;
          fVar165 = fVar178 - fVar188;
          fVar171 = fVar225 - fVar190;
          fVar94 = fVar173 - fVar199;
          fVar95 = fVar182 - fVar203;
          fStack_10d0 = fVar183 - fVar207;
          fStack_10cc = fVar189 - fVar217;
          fVar214 = fVar71 - fVar201;
          fVar218 = fVar73 - fVar204;
          fVar222 = fVar93 - fVar206;
          fVar226 = fVar163 - fVar208;
          local_10e8 = *(float *)(ray + k * 4 + 0x60);
          local_10d8 = (Geometry *)CONCAT44(fVar95,fVar94);
          fVar215 = fVar184 - fVar170;
          fVar219 = fVar187 - fVar172;
          fVar223 = fVar188 - fVar174;
          fVar227 = fVar190 - fVar180;
          fVar125 = fVar199 - fVar193;
          fVar135 = fVar203 - fVar194;
          fVar156 = fVar207 - fVar195;
          fVar159 = fVar217 - fVar197;
          fVar209 = (fVar94 * (fVar71 + fVar201) - (fVar173 + fVar199) * fVar214) * fVar11 +
                    ((fVar158 + fVar184) * fVar214 - (fVar71 + fVar201) * fVar146) * fVar164 +
                    (fVar146 * (fVar173 + fVar199) - (fVar158 + fVar184) * fVar94) * local_10e8;
          fVar210 = (fVar95 * (fVar73 + fVar204) - (fVar182 + fVar203) * fVar218) * fVar11 +
                    ((fVar181 + fVar187) * fVar218 - (fVar73 + fVar204) * fVar162) * fVar164 +
                    (fVar162 * (fVar182 + fVar203) - (fVar181 + fVar187) * fVar95) * local_10e8;
          fVar211 = (fStack_10d0 * (fVar93 + fVar206) - (fVar183 + fVar207) * fVar222) * fVar11 +
                    ((fVar178 + fVar188) * fVar222 - (fVar93 + fVar206) * fVar165) * fVar164 +
                    (fVar165 * (fVar183 + fVar207) - (fVar178 + fVar188) * fStack_10d0) * local_10e8
          ;
          fVar212 = (fStack_10cc * (fVar163 + fVar208) - (fVar189 + fVar217) * fVar226) * fVar11 +
                    ((fVar225 + fVar190) * fVar226 - (fVar163 + fVar208) * fVar171) * fVar164 +
                    (fVar171 * (fVar189 + fVar217) - (fVar225 + fVar190) * fStack_10cc) * local_10e8
          ;
          fVar69 = fVar201 - fVar161;
          fVar70 = fVar204 - fVar157;
          fStack_10f0 = fVar206 - fVar176;
          fStack_10ec = fVar208 - fVar177;
          local_10f8 = CONCAT44(fVar70,fVar69);
          auVar132._0_4_ =
               (fVar125 * (fVar201 + fVar161) - (fVar199 + fVar193) * fVar69) * fVar11 +
               ((fVar184 + fVar170) * fVar69 - (fVar201 + fVar161) * fVar215) * fVar164 +
               (fVar215 * (fVar199 + fVar193) - (fVar184 + fVar170) * fVar125) * local_10e8;
          auVar132._4_4_ =
               (fVar135 * (fVar204 + fVar157) - (fVar203 + fVar194) * fVar70) * fVar11 +
               ((fVar187 + fVar172) * fVar70 - (fVar204 + fVar157) * fVar219) * fVar164 +
               (fVar219 * (fVar203 + fVar194) - (fVar187 + fVar172) * fVar135) * local_10e8;
          auVar132._8_4_ =
               (fVar156 * (fVar206 + fVar176) - (fVar207 + fVar195) * fStack_10f0) * fVar11 +
               ((fVar188 + fVar174) * fStack_10f0 - (fVar206 + fVar176) * fVar223) * fVar164 +
               (fVar223 * (fVar207 + fVar195) - (fVar188 + fVar174) * fVar156) * local_10e8;
          auVar132._12_4_ =
               (fVar159 * (fVar208 + fVar177) - (fVar217 + fVar197) * fStack_10ec) * fVar11 +
               ((fVar190 + fVar180) * fStack_10ec - (fVar208 + fVar177) * fVar227) * fVar164 +
               (fVar227 * (fVar217 + fVar197) - (fVar190 + fVar180) * fVar159) * local_10e8;
          fVar56 = fVar170 - fVar158;
          fVar55 = fVar172 - fVar181;
          fVar72 = fVar174 - fVar178;
          fVar57 = fVar180 - fVar225;
          fVar200 = fVar193 - fVar173;
          fVar205 = fVar194 - fVar182;
          fVar213 = fVar195 - fVar183;
          fVar221 = fVar197 - fVar189;
          fVar175 = fVar161 - fVar71;
          fVar179 = fVar157 - fVar73;
          fVar196 = fVar176 - fVar93;
          fVar198 = fVar177 - fVar163;
          fStack_10e4 = local_10e8;
          fStack_10e0 = local_10e8;
          fStack_10dc = local_10e8;
          auVar60._0_4_ =
               (fVar200 * (fVar71 + fVar161) - (fVar173 + fVar193) * fVar175) * fVar11 +
               ((fVar158 + fVar170) * fVar175 - (fVar71 + fVar161) * fVar56) * fVar164 +
               (fVar56 * (fVar173 + fVar193) - (fVar158 + fVar170) * fVar200) * local_10e8;
          auVar60._4_4_ =
               (fVar205 * (fVar73 + fVar157) - (fVar182 + fVar194) * fVar179) * fVar11 +
               ((fVar181 + fVar172) * fVar179 - (fVar73 + fVar157) * fVar55) * fVar164 +
               (fVar55 * (fVar182 + fVar194) - (fVar181 + fVar172) * fVar205) * local_10e8;
          auVar60._8_4_ =
               (fVar213 * (fVar93 + fVar176) - (fVar183 + fVar195) * fVar196) * fVar11 +
               ((fVar178 + fVar174) * fVar196 - (fVar93 + fVar176) * fVar72) * fVar164 +
               (fVar72 * (fVar183 + fVar195) - (fVar178 + fVar174) * fVar213) * local_10e8;
          auVar60._12_4_ =
               (fVar221 * (fVar163 + fVar177) - (fVar189 + fVar197) * fVar198) * fVar11 +
               ((fVar225 + fVar180) * fVar198 - (fVar163 + fVar177) * fVar57) * fVar164 +
               (fVar57 * (fVar189 + fVar197) - (fVar225 + fVar180) * fVar221) * local_10e8;
          auVar118._0_4_ = fVar209 + auVar132._0_4_ + auVar60._0_4_;
          auVar118._4_4_ = fVar210 + auVar132._4_4_ + auVar60._4_4_;
          auVar118._8_4_ = fVar211 + auVar132._8_4_ + auVar60._8_4_;
          auVar118._12_4_ = fVar212 + auVar132._12_4_ + auVar60._12_4_;
          auVar152._4_4_ = fVar210;
          auVar152._0_4_ = fVar209;
          auVar152._8_4_ = fVar211;
          auVar152._12_4_ = fVar212;
          auVar150 = minps(auVar152,auVar132);
          auVar150 = minps(auVar150,auVar60);
          auVar168._4_4_ = fVar210;
          auVar168._0_4_ = fVar209;
          auVar168._8_4_ = fVar211;
          auVar168._12_4_ = fVar212;
          auVar96 = maxps(auVar168,auVar132);
          auVar96 = maxps(auVar96,auVar60);
          local_1108 = ABS(auVar118._0_4_);
          fStack_1104 = ABS(auVar118._4_4_);
          fStack_1100 = ABS(auVar118._8_4_);
          fStack_10fc = ABS(auVar118._12_4_);
          auVar169._4_4_ = -(uint)(auVar96._4_4_ <= fStack_1104 * 1.1920929e-07);
          auVar169._0_4_ = -(uint)(auVar96._0_4_ <= local_1108 * 1.1920929e-07);
          auVar169._8_4_ = -(uint)(auVar96._8_4_ <= fStack_1100 * 1.1920929e-07);
          auVar169._12_4_ = -(uint)(auVar96._12_4_ <= fStack_10fc * 1.1920929e-07);
          auVar153._4_4_ = -(uint)(-(fStack_1104 * 1.1920929e-07) <= auVar150._4_4_);
          auVar153._0_4_ = -(uint)(-(local_1108 * 1.1920929e-07) <= auVar150._0_4_);
          auVar153._8_4_ = -(uint)(-(fStack_1100 * 1.1920929e-07) <= auVar150._8_4_);
          auVar153._12_4_ = -(uint)(-(fStack_10fc * 1.1920929e-07) <= auVar150._12_4_);
          auVar169 = auVar169 | auVar153;
          iVar28 = movmskps(uVar36,auVar169);
          local_1218 = uVar34;
          local_1210 = uVar42;
          if (iVar28 != 0) {
            uVar44 = (uint)DAT_01f7b6c0;
            uVar47 = DAT_01f7b6c0._4_4_;
            uVar50 = DAT_01f7b6c0._8_4_;
            uVar53 = DAT_01f7b6c0._12_4_;
            uVar36 = -(uint)((float)((uint)(fVar200 * fVar69) & uVar44) <=
                            (float)((uint)(fVar125 * fVar214) & uVar44));
            uVar45 = -(uint)((float)((uint)(fVar205 * fVar70) & uVar47) <=
                            (float)((uint)(fVar135 * fVar218) & uVar47));
            uVar48 = -(uint)((float)((uint)(fVar213 * fStack_10f0) & uVar50) <=
                            (float)((uint)(fVar156 * fVar222) & uVar50));
            uVar51 = -(uint)((float)((uint)(fVar221 * fStack_10ec) & uVar53) <=
                            (float)((uint)(fVar159 * fVar226) & uVar53));
            uVar43 = -(uint)((float)((uint)(fVar215 * fVar175) & uVar44) <=
                            (float)((uint)(fVar146 * fVar69) & uVar44));
            uVar46 = -(uint)((float)((uint)(fVar219 * fVar179) & uVar47) <=
                            (float)((uint)(fVar162 * fVar70) & uVar47));
            uVar49 = -(uint)((float)((uint)(fVar223 * fVar196) & uVar50) <=
                            (float)((uint)(fVar165 * fStack_10f0) & uVar50));
            uVar52 = -(uint)((float)((uint)(fVar227 * fVar198) & uVar53) <=
                            (float)((uint)(fVar171 * fStack_10ec) & uVar53));
            uVar44 = -(uint)((float)((uint)(fVar56 * fVar125) & uVar44) <=
                            (float)((uint)(fVar215 * fVar94) & uVar44));
            uVar47 = -(uint)((float)((uint)(fVar55 * fVar135) & uVar47) <=
                            (float)((uint)(fVar219 * fVar95) & uVar47));
            uVar50 = -(uint)((float)((uint)(fVar72 * fVar156) & uVar50) <=
                            (float)((uint)(fVar223 * fStack_10d0) & uVar50));
            uVar53 = -(uint)((float)((uint)(fVar57 * fVar159) & uVar53) <=
                            (float)((uint)(fVar227 * fStack_10cc) & uVar53));
            auVar143._0_4_ = (uint)(fVar125 * fVar175 - fVar200 * fVar69) & uVar36;
            auVar143._4_4_ = (uint)(fVar135 * fVar179 - fVar205 * fVar70) & uVar45;
            auVar143._8_4_ = (uint)(fVar156 * fVar196 - fVar213 * fStack_10f0) & uVar48;
            auVar143._12_4_ = (uint)(fVar159 * fVar198 - fVar221 * fStack_10ec) & uVar51;
            auVar185._0_4_ = ~uVar36 & (uint)(fVar94 * fVar69 - fVar125 * fVar214);
            auVar185._4_4_ = ~uVar45 & (uint)(fVar95 * fVar70 - fVar135 * fVar218);
            auVar185._8_4_ = ~uVar48 & (uint)(fStack_10d0 * fStack_10f0 - fVar156 * fVar222);
            auVar185._12_4_ = ~uVar51 & (uint)(fStack_10cc * fStack_10ec - fVar159 * fVar226);
            auVar185 = auVar185 | auVar143;
            fVar69 = (float)(~uVar43 & (uint)(fVar214 * fVar215 - fVar146 * fVar69) |
                            (uint)(fVar56 * fVar69 - fVar215 * fVar175) & uVar43);
            fVar70 = (float)(~uVar46 & (uint)(fVar218 * fVar219 - fVar162 * fVar70) |
                            (uint)(fVar55 * fVar70 - fVar219 * fVar179) & uVar46);
            fVar71 = (float)(~uVar49 & (uint)(fVar222 * fVar223 - fVar165 * fStack_10f0) |
                            (uint)(fVar72 * fStack_10f0 - fVar223 * fVar196) & uVar49);
            fVar73 = (float)(~uVar52 & (uint)(fVar226 * fVar227 - fVar171 * fStack_10ec) |
                            (uint)(fVar57 * fStack_10ec - fVar227 * fVar198) & uVar52);
            fVar93 = (float)(~uVar44 & (uint)(fVar146 * fVar125 - fVar215 * fVar94) |
                            (uint)(fVar215 * fVar200 - fVar56 * fVar125) & uVar44);
            fVar94 = (float)(~uVar47 & (uint)(fVar162 * fVar135 - fVar219 * fVar95) |
                            (uint)(fVar219 * fVar205 - fVar55 * fVar135) & uVar47);
            fVar95 = (float)(~uVar50 & (uint)(fVar165 * fVar156 - fVar223 * fStack_10d0) |
                            (uint)(fVar223 * fVar213 - fVar72 * fVar156) & uVar50);
            fVar125 = (float)(~uVar53 & (uint)(fVar171 * fVar159 - fVar227 * fStack_10cc) |
                             (uint)(fVar227 * fVar221 - fVar57 * fVar159) & uVar53);
            fVar56 = fVar11 * auVar185._0_4_ + fVar164 * fVar69 + local_10e8 * fVar93;
            fVar55 = fVar11 * auVar185._4_4_ + fVar164 * fVar70 + local_10e8 * fVar94;
            fVar72 = fVar11 * auVar185._8_4_ + fVar164 * fVar71 + local_10e8 * fVar95;
            fVar57 = fVar11 * auVar185._12_4_ + fVar164 * fVar73 + local_10e8 * fVar125;
            auVar160._0_4_ = fVar56 + fVar56;
            auVar160._4_4_ = fVar55 + fVar55;
            auVar160._8_4_ = fVar72 + fVar72;
            auVar160._12_4_ = fVar57 + fVar57;
            auVar61._0_4_ = fVar199 * fVar69 + fVar201 * fVar93;
            auVar61._4_4_ = fVar203 * fVar70 + fVar204 * fVar94;
            auVar61._8_4_ = fVar207 * fVar71 + fVar206 * fVar95;
            auVar61._12_4_ = fVar217 * fVar73 + fVar208 * fVar125;
            fVar56 = fVar184 * auVar185._0_4_ + auVar61._0_4_;
            fVar55 = fVar187 * auVar185._4_4_ + auVar61._4_4_;
            fVar72 = fVar188 * auVar185._8_4_ + auVar61._8_4_;
            fVar57 = fVar190 * auVar185._12_4_ + auVar61._12_4_;
            auVar119._0_4_ = fVar56 + fVar56;
            auVar119._4_4_ = fVar55 + fVar55;
            auVar119._8_4_ = fVar72 + fVar72;
            auVar119._12_4_ = fVar57 + fVar57;
            auVar150 = rcpps(auVar61,auVar160);
            fVar56 = auVar150._0_4_;
            fVar55 = auVar150._4_4_;
            fVar72 = auVar150._8_4_;
            fVar57 = auVar150._12_4_;
            fVar135 = ((1.0 - auVar160._0_4_ * fVar56) * fVar56 + fVar56) * auVar119._0_4_;
            fVar156 = ((1.0 - auVar160._4_4_ * fVar55) * fVar55 + fVar55) * auVar119._4_4_;
            fVar72 = ((1.0 - auVar160._8_4_ * fVar72) * fVar72 + fVar72) * auVar119._8_4_;
            fVar57 = ((1.0 - auVar160._12_4_ * fVar57) * fVar57 + fVar57) * auVar119._12_4_;
            fVar55 = *(float *)(ray + k * 4 + 0x80);
            fVar56 = *(float *)(ray + k * 4 + 0x30);
            auVar62._0_4_ = -(uint)(fVar135 <= fVar55 && fVar56 <= fVar135) & auVar169._0_4_;
            auVar62._4_4_ = -(uint)(fVar156 <= fVar55 && fVar56 <= fVar156) & auVar169._4_4_;
            auVar62._8_4_ = -(uint)(fVar72 <= fVar55 && fVar56 <= fVar72) & auVar169._8_4_;
            auVar62._12_4_ = -(uint)(fVar57 <= fVar55 && fVar56 <= fVar57) & auVar169._12_4_;
            iVar28 = movmskps(iVar28,auVar62);
            if (iVar28 != 0) {
              aVar63._0_4_ = auVar62._0_4_ & -(uint)(auVar160._0_4_ != 0.0);
              aVar63._4_4_ = auVar62._4_4_ & -(uint)(auVar160._4_4_ != 0.0);
              aVar63._8_4_ = auVar62._8_4_ & -(uint)(auVar160._8_4_ != 0.0);
              aVar63._12_4_ = auVar62._12_4_ & -(uint)(auVar160._12_4_ != 0.0);
              iVar28 = movmskps(iVar28,(undefined1  [16])aVar63);
              if (iVar28 != 0) {
                uStack_1250._0_4_ = pGVar15->_geomID;
                uVar36 = pGVar15->_primID;
                tNear.field_0.v[1] = fVar210;
                tNear.field_0.v[0] = fVar209;
                tNear.field_0.v[3] = fVar212;
                tNear.field_0.v[2] = fVar211;
                local_1148[0] = fVar135;
                local_1148[1] = fVar156;
                local_1148[2] = fVar72;
                local_1148[3] = fVar57;
                _local_1138 = auVar185;
                local_1128._4_4_ = fVar70;
                local_1128._0_4_ = fVar69;
                fStack_1120 = fVar71;
                fStack_111c = fVar73;
                local_1118[0] = fVar93;
                local_1118[1] = fVar94;
                local_1118[2] = fVar95;
                local_1118[3] = fVar125;
                pGVar14 = (context->scene->geometries).items[(uint)uStack_1250].ptr;
                root.ptr = (size_t)*(uint *)(ray + k * 4 + 0x90);
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar56 = local_1220[1];
                  pfVar8 = local_1220 + uVar34;
                  fVar69 = *pfVar8;
                  fVar70 = pfVar8[1];
                  fVar71 = local_1220[2];
                  fVar73 = pfVar8[2];
                  if (uVar34 == 2) {
                    fVar71 = fVar56;
                    fVar73 = fVar70;
                  }
                  auVar150 = rcpps(auVar119,auVar118);
                  fVar93 = auVar150._0_4_;
                  fVar94 = auVar150._4_4_;
                  fVar95 = auVar150._8_4_;
                  fVar125 = auVar150._12_4_;
                  fVar93 = (float)(-(uint)(1e-18 <= local_1108) &
                                  (uint)(((float)DAT_01f7ba10 - auVar118._0_4_ * fVar93) * fVar93 +
                                        fVar93));
                  fVar94 = (float)(-(uint)(1e-18 <= fStack_1104) &
                                  (uint)((DAT_01f7ba10._4_4_ - auVar118._4_4_ * fVar94) * fVar94 +
                                        fVar94));
                  fVar95 = (float)(-(uint)(1e-18 <= fStack_1100) &
                                  (uint)((DAT_01f7ba10._8_4_ - auVar118._8_4_ * fVar95) * fVar95 +
                                        fVar95));
                  fVar125 = (float)(-(uint)(1e-18 <= fStack_10fc) &
                                   (uint)((DAT_01f7ba10._12_4_ - auVar118._12_4_ * fVar125) *
                                          fVar125 + fVar125));
                  auVar186._0_4_ = fVar209 * fVar93;
                  auVar186._4_4_ = fVar210 * fVar94;
                  auVar186._8_4_ = fVar211 * fVar95;
                  auVar186._12_4_ = fVar212 * fVar125;
                  auVar150 = minps(auVar186,_DAT_01f7ba10);
                  auVar192._0_4_ = auVar132._0_4_ * fVar93;
                  auVar192._4_4_ = auVar132._4_4_ * fVar94;
                  auVar192._8_4_ = auVar132._8_4_ * fVar95;
                  auVar192._12_4_ = auVar132._12_4_ * fVar125;
                  auVar96 = minps(auVar192,_DAT_01f7ba10);
                  uVar43 = (uint)DAT_01fab980;
                  uVar44 = DAT_01fab980._4_4_;
                  uVar45 = DAT_01fab980._8_4_;
                  uVar46 = DAT_01fab980._12_4_;
                  fVar159 = auVar150._0_4_;
                  fVar161 = auVar150._4_4_;
                  fVar146 = auVar150._8_4_;
                  fVar162 = auVar150._12_4_;
                  fVar165 = auVar96._0_4_;
                  fVar171 = auVar96._4_4_;
                  fVar173 = auVar96._8_4_;
                  fVar175 = auVar96._12_4_;
                  fVar93 = ((float)DAT_01f7ba10 - fVar159) - fVar165;
                  fVar94 = (DAT_01f7ba10._4_4_ - fVar161) - fVar171;
                  fVar95 = (DAT_01f7ba10._8_4_ - fVar146) - fVar173;
                  fVar125 = (DAT_01f7ba10._12_4_ - fVar162) - fVar175;
                  local_1168[0] =
                       (float)(int)((uint)*local_1220 & uVar43) * 0.00012207031 * fVar93 +
                       (float)(int)((uint)fVar69 & uVar43) * 0.00012207031 * fVar165 +
                       (float)(int)((uint)fVar56 & uVar43) * 0.00012207031 * fVar159;
                  local_1168[1] =
                       (float)(int)((uint)fVar69 & uVar44) * 0.00012207031 * fVar94 +
                       (float)(int)((uint)fVar70 & uVar44) * 0.00012207031 * fVar171 +
                       (float)(int)((uint)fVar56 & uVar44) * 0.00012207031 * fVar161;
                  local_1168[2] =
                       (float)(int)((uint)fVar56 & uVar45) * 0.00012207031 * fVar95 +
                       (float)(int)((uint)fVar70 & uVar45) * 0.00012207031 * fVar173 +
                       (float)(int)((uint)fVar71 & uVar45) * 0.00012207031 * fVar146;
                  local_1168[3] =
                       (float)(int)((uint)fVar70 & uVar46) * 0.00012207031 * fVar125 +
                       (float)(int)((uint)fVar73 & uVar46) * 0.00012207031 * fVar175 +
                       (float)(int)((uint)fVar71 & uVar46) * 0.00012207031 * fVar162;
                  local_1158[0] =
                       fVar93 * (float)((uint)*local_1220 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar69 >> 0x10) * 0.00012207031 * fVar165 +
                       (float)((uint)fVar56 >> 0x10) * 0.00012207031 * fVar159;
                  local_1158[1] =
                       fVar94 * (float)((uint)fVar69 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar70 >> 0x10) * 0.00012207031 * fVar171 +
                       (float)((uint)fVar56 >> 0x10) * 0.00012207031 * fVar161;
                  local_1158[2] =
                       fVar95 * (float)((uint)fVar56 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar70 >> 0x10) * 0.00012207031 * fVar173 +
                       (float)((uint)fVar71 >> 0x10) * 0.00012207031 * fVar146;
                  local_1158[3] =
                       fVar125 * (float)((uint)fVar70 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar73 >> 0x10) * 0.00012207031 * fVar175 +
                       (float)((uint)fVar71 >> 0x10) * 0.00012207031 * fVar162;
                  auVar81._0_4_ = (uint)fVar135 & aVar63._0_4_;
                  auVar81._4_4_ = (uint)fVar156 & aVar63._4_4_;
                  auVar81._8_4_ = (uint)fVar72 & aVar63._8_4_;
                  auVar81._12_4_ = (uint)fVar57 & aVar63._12_4_;
                  auVar102._0_8_ = CONCAT44(~aVar63._4_4_,~aVar63._0_4_) & 0x7f8000007f800000;
                  auVar102._8_4_ = ~aVar63._8_4_ & 0x7f800000;
                  auVar102._12_4_ = ~aVar63._12_4_ & 0x7f800000;
                  auVar102 = auVar102 | auVar81;
                  auVar120._4_4_ = auVar102._0_4_;
                  auVar120._0_4_ = auVar102._4_4_;
                  auVar120._8_4_ = auVar102._12_4_;
                  auVar120._12_4_ = auVar102._8_4_;
                  auVar150 = minps(auVar120,auVar102);
                  auVar82._0_8_ = auVar150._8_8_;
                  auVar82._8_4_ = auVar150._0_4_;
                  auVar82._12_4_ = auVar150._4_4_;
                  auVar150 = minps(auVar82,auVar150);
                  uVar47 = -(uint)(auVar150._0_4_ == auVar102._0_4_);
                  uVar48 = -(uint)(auVar150._4_4_ == auVar102._4_4_);
                  uVar49 = -(uint)(auVar150._8_4_ == auVar102._8_4_);
                  uVar50 = -(uint)(auVar150._12_4_ == auVar102._12_4_);
                  auVar103._0_4_ = uVar47 & aVar63._0_4_;
                  auVar103._4_4_ = uVar48 & aVar63._4_4_;
                  auVar103._8_4_ = uVar49 & aVar63._8_4_;
                  auVar103._12_4_ = uVar50 & aVar63._12_4_;
                  iVar28 = movmskps((int)local_1220,auVar103);
                  uVar43 = 0xffffffff;
                  uVar44 = 0xffffffff;
                  uVar45 = 0xffffffff;
                  uVar46 = 0xffffffff;
                  if (iVar28 != 0) {
                    uVar43 = uVar47;
                    uVar44 = uVar48;
                    uVar45 = uVar49;
                    uVar46 = uVar50;
                  }
                  auVar64._0_4_ = aVar63._0_4_ & uVar43;
                  auVar64._4_4_ = aVar63._4_4_ & uVar44;
                  auVar64._8_4_ = aVar63._8_4_ & uVar45;
                  auVar64._12_4_ = aVar63._12_4_ & uVar46;
                  uVar37 = movmskps(iVar28,auVar64);
                  uVar31 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar37);
                  lVar32 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                    }
                  }
                  root.ptr = (size_t)context->args;
                  valid.field_0 = aVar63;
                  if ((((Geometry *)root.ptr)->device == (Device *)0x0) &&
                     (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar56 = local_1168[lVar32];
                    fVar55 = local_1158[lVar32];
                    uVar37 = *(undefined4 *)(local_1138 + lVar32 * 4);
                    fVar72 = local_1118[lVar32 + -4];
                    fVar57 = local_1118[lVar32];
                    *(float *)(ray + k * 4 + 0x80) = local_1148[lVar32];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar37;
                    *(float *)(ray + k * 4 + 0xd0) = fVar72;
                    *(float *)(ray + k * 4 + 0xe0) = fVar57;
                    *(float *)(ray + k * 4 + 0xf0) = fVar56;
                    *(float *)(ray + k * 4 + 0x100) = fVar55;
                    *(uint *)(ray + k * 4 + 0x110) = uVar36;
                    *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_1250;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_1258 = CONCAT44((uint)uStack_1250,(uint)uStack_1250);
                    uStack_1250._4_4_ = (uint)uStack_1250;
                    local_12b8 = CONCAT44(uVar36,uVar36);
                    auVar24 = *(undefined1 (*) [12])
                               *(undefined1 (*) [16])(mm_lookupmask_ps + lVar29);
                    fStack_129c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar29 + 8) >>
                                         0x20);
                    while( true ) {
                      local_1098 = local_1168[lVar32];
                      fVar56 = local_1158[lVar32];
                      *(float *)(ray + k * 4 + 0x80) = local_1148[lVar32];
                      args.context = context->user;
                      local_1088._4_4_ = fVar56;
                      local_1088._0_4_ = fVar56;
                      local_1088._8_4_ = fVar56;
                      local_1088._12_4_ = fVar56;
                      local_10c8 = *(undefined4 *)(local_1138 + lVar32 * 4);
                      fVar56 = local_1118[lVar32 + -4];
                      fVar69 = local_1118[lVar32];
                      local_10b8._4_4_ = fVar56;
                      local_10b8._0_4_ = fVar56;
                      local_10b8._8_4_ = fVar56;
                      local_10b8._12_4_ = fVar56;
                      local_10a8._4_4_ = fVar69;
                      local_10a8._0_4_ = fVar69;
                      local_10a8._8_4_ = fVar69;
                      local_10a8._12_4_ = fVar69;
                      uStack_10c4 = local_10c8;
                      uStack_10c0 = local_10c8;
                      uStack_10bc = local_10c8;
                      fStack_1094 = local_1098;
                      fStack_1090 = local_1098;
                      fStack_108c = local_1098;
                      local_1078 = local_12b8;
                      uStack_1070 = CONCAT44(uVar36,uVar36);
                      local_1068 = local_1258;
                      uStack_1060 = uStack_1250;
                      local_1058 = (args.context)->instID[0];
                      uStack_1054 = local_1058;
                      uStack_1050 = local_1058;
                      uStack_104c = local_1058;
                      local_1048 = (args.context)->instPrimID[0];
                      uStack_1044 = local_1048;
                      uStack_1040 = local_1048;
                      uStack_103c = local_1048;
                      local_1238._12_4_ = fStack_129c;
                      local_1238._0_12_ = auVar24;
                      args.valid = (int *)local_1238;
                      args.geometryUserPtr = pGVar14->userPtr;
                      args.hit = (RTCHitN *)&local_10c8;
                      args.N = 4;
                      p_Var16 = pGVar14->intersectionFilterN;
                      auVar230._8_8_ = root.ptr;
                      auVar230._0_8_ = p_Var16;
                      args.ray = (RTCRayN *)ray;
                      if (p_Var16 != (RTCFilterFunctionN)0x0) {
                        auVar230 = (*p_Var16)(&args);
                      }
                      root.ptr = auVar230._8_8_;
                      auVar88._0_4_ = -(uint)(local_1238._0_4_ == 0);
                      auVar88._4_4_ = -(uint)(local_1238._4_4_ == 0);
                      auVar88._8_4_ = -(uint)(local_1238._8_4_ == 0);
                      auVar88._12_4_ = -(uint)(local_1238._12_4_ == 0);
                      uVar43 = movmskps(auVar230._0_4_,auVar88);
                      pRVar33 = (RTCRayN *)(ulong)(uVar43 ^ 0xf);
                      if ((uVar43 ^ 0xf) == 0) {
                        auVar88 = auVar88 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        auVar26._8_8_ = root.ptr;
                        auVar26._0_8_ = p_Var16;
                        auVar231._8_8_ = root.ptr;
                        auVar231._0_8_ = p_Var16;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (auVar231 = auVar26, ((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar231 = (*p_Var16)(&args);
                        }
                        root.ptr = auVar231._8_8_;
                        auVar67._0_4_ = -(uint)(local_1238._0_4_ == 0);
                        auVar67._4_4_ = -(uint)(local_1238._4_4_ == 0);
                        auVar67._8_4_ = -(uint)(local_1238._8_4_ == 0);
                        auVar67._12_4_ = -(uint)(local_1238._12_4_ == 0);
                        auVar88 = auVar67 ^ _DAT_01f7ae20;
                        uVar43 = movmskps(auVar231._0_4_,auVar67);
                        pRVar33 = (RTCRayN *)(ulong)(uVar43 ^ 0xf);
                        if ((uVar43 ^ 0xf) != 0) {
                          auVar109._0_4_ = *(uint *)(args.ray + 0xc0) & auVar67._0_4_;
                          auVar109._4_4_ = *(uint *)(args.ray + 0xc4) & auVar67._4_4_;
                          auVar109._8_4_ = *(uint *)(args.ray + 200) & auVar67._8_4_;
                          auVar109._12_4_ = *(uint *)(args.ray + 0xcc) & auVar67._12_4_;
                          auVar155._0_4_ = ~auVar67._0_4_ & *(uint *)args.hit;
                          auVar155._4_4_ = ~auVar67._4_4_ & *(uint *)(args.hit + 4);
                          auVar155._8_4_ = ~auVar67._8_4_ & *(uint *)(args.hit + 8);
                          auVar155._12_4_ = ~auVar67._12_4_ & *(uint *)(args.hit + 0xc);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar155 | auVar109;
                          uVar43 = *(uint *)(args.hit + 0x14);
                          uVar44 = *(uint *)(args.hit + 0x18);
                          uVar45 = *(uint *)(args.hit + 0x1c);
                          *(uint *)(args.ray + 0xd0) =
                               ~auVar67._0_4_ & *(uint *)(args.hit + 0x10) |
                               *(uint *)(args.ray + 0xd0) & auVar67._0_4_;
                          *(uint *)(args.ray + 0xd4) =
                               ~auVar67._4_4_ & uVar43 | *(uint *)(args.ray + 0xd4) & auVar67._4_4_;
                          *(uint *)(args.ray + 0xd8) =
                               ~auVar67._8_4_ & uVar44 | *(uint *)(args.ray + 0xd8) & auVar67._8_4_;
                          *(uint *)(args.ray + 0xdc) =
                               ~auVar67._12_4_ & uVar45 |
                               *(uint *)(args.ray + 0xdc) & auVar67._12_4_;
                          auVar134._0_4_ = *(uint *)(args.ray + 0xe0) & auVar67._0_4_;
                          auVar134._4_4_ = *(uint *)(args.ray + 0xe4) & auVar67._4_4_;
                          auVar134._8_4_ = *(uint *)(args.ray + 0xe8) & auVar67._8_4_;
                          auVar134._12_4_ = *(uint *)(args.ray + 0xec) & auVar67._12_4_;
                          auVar110._0_4_ = ~auVar67._0_4_ & *(uint *)(args.hit + 0x20);
                          auVar110._4_4_ = ~auVar67._4_4_ & *(uint *)(args.hit + 0x24);
                          auVar110._8_4_ = ~auVar67._8_4_ & *(uint *)(args.hit + 0x28);
                          auVar110._12_4_ = ~auVar67._12_4_ & *(uint *)(args.hit + 0x2c);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar110 | auVar134;
                          auVar145._0_4_ = *(uint *)(args.ray + 0xf0) & auVar67._0_4_;
                          auVar145._4_4_ = *(uint *)(args.ray + 0xf4) & auVar67._4_4_;
                          auVar145._8_4_ = *(uint *)(args.ray + 0xf8) & auVar67._8_4_;
                          auVar145._12_4_ = *(uint *)(args.ray + 0xfc) & auVar67._12_4_;
                          auVar111._0_4_ = ~auVar67._0_4_ & *(uint *)(args.hit + 0x30);
                          auVar111._4_4_ = ~auVar67._4_4_ & *(uint *)(args.hit + 0x34);
                          auVar111._8_4_ = ~auVar67._8_4_ & *(uint *)(args.hit + 0x38);
                          auVar111._12_4_ = ~auVar67._12_4_ & *(uint *)(args.hit + 0x3c);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar111 | auVar145;
                          uVar43 = *(uint *)(args.hit + 0x44);
                          uVar44 = *(uint *)(args.hit + 0x48);
                          uVar45 = *(uint *)(args.hit + 0x4c);
                          *(uint *)(args.ray + 0x100) =
                               ~auVar67._0_4_ & *(uint *)(args.hit + 0x40) |
                               *(uint *)(args.ray + 0x100) & auVar67._0_4_;
                          *(uint *)(args.ray + 0x104) =
                               ~auVar67._4_4_ & uVar43 | *(uint *)(args.ray + 0x104) & auVar67._4_4_
                          ;
                          *(uint *)(args.ray + 0x108) =
                               ~auVar67._8_4_ & uVar44 | *(uint *)(args.ray + 0x108) & auVar67._8_4_
                          ;
                          *(uint *)(args.ray + 0x10c) =
                               ~auVar67._12_4_ & uVar45 |
                               *(uint *)(args.ray + 0x10c) & auVar67._12_4_;
                          uVar43 = *(uint *)(args.hit + 0x54);
                          uVar44 = *(uint *)(args.hit + 0x58);
                          uVar45 = *(uint *)(args.hit + 0x5c);
                          *(uint *)(args.ray + 0x110) =
                               *(uint *)(args.ray + 0x110) & auVar67._0_4_ |
                               ~auVar67._0_4_ & *(uint *)(args.hit + 0x50);
                          *(uint *)(args.ray + 0x114) =
                               *(uint *)(args.ray + 0x114) & auVar67._4_4_ | ~auVar67._4_4_ & uVar43
                          ;
                          *(uint *)(args.ray + 0x118) =
                               *(uint *)(args.ray + 0x118) & auVar67._8_4_ | ~auVar67._8_4_ & uVar44
                          ;
                          *(uint *)(args.ray + 0x11c) =
                               *(uint *)(args.ray + 0x11c) & auVar67._12_4_ |
                               ~auVar67._12_4_ & uVar45;
                          uVar43 = *(uint *)(args.hit + 100);
                          uVar44 = *(uint *)(args.hit + 0x68);
                          uVar45 = *(uint *)(args.hit + 0x6c);
                          *(uint *)(args.ray + 0x120) =
                               *(uint *)(args.ray + 0x120) & auVar67._0_4_ |
                               ~auVar67._0_4_ & *(uint *)(args.hit + 0x60);
                          *(uint *)(args.ray + 0x124) =
                               *(uint *)(args.ray + 0x124) & auVar67._4_4_ | ~auVar67._4_4_ & uVar43
                          ;
                          *(uint *)(args.ray + 0x128) =
                               *(uint *)(args.ray + 0x128) & auVar67._8_4_ | ~auVar67._8_4_ & uVar44
                          ;
                          *(uint *)(args.ray + 300) =
                               *(uint *)(args.ray + 300) & auVar67._12_4_ | ~auVar67._12_4_ & uVar45
                          ;
                          auVar112._0_4_ = *(uint *)(args.ray + 0x130) & auVar67._0_4_;
                          auVar112._4_4_ = *(uint *)(args.ray + 0x134) & auVar67._4_4_;
                          auVar112._8_4_ = *(uint *)(args.ray + 0x138) & auVar67._8_4_;
                          auVar112._12_4_ = *(uint *)(args.ray + 0x13c) & auVar67._12_4_;
                          auVar123._0_4_ = ~auVar67._0_4_ & *(uint *)(args.hit + 0x70);
                          auVar123._4_4_ = ~auVar67._4_4_ & *(uint *)(args.hit + 0x74);
                          auVar123._8_4_ = ~auVar67._8_4_ & *(uint *)(args.hit + 0x78);
                          auVar123._12_4_ = ~auVar67._12_4_ & *(uint *)(args.hit + 0x7c);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar123 | auVar112;
                          *(undefined1 (*) [16])(args.ray + 0x140) =
                               ~auVar67 & *(undefined1 (*) [16])(args.hit + 0x80) |
                               *(undefined1 (*) [16])(args.ray + 0x140) & auVar67;
                          pRVar33 = args.ray;
                        }
                      }
                      auVar89._0_4_ = auVar88._0_4_ << 0x1f;
                      auVar89._4_4_ = auVar88._4_4_ << 0x1f;
                      auVar89._8_4_ = auVar88._8_4_ << 0x1f;
                      auVar89._12_4_ = auVar88._12_4_ << 0x1f;
                      iVar28 = movmskps((int)pRVar33,auVar89);
                      if (iVar28 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar55;
                      }
                      else {
                        fVar55 = *(float *)(ray + k * 4 + 0x80);
                      }
                      *(undefined4 *)(local_1238 + lVar32 * 4 + -0x10) = 0;
                      valid.field_0.i[0] = -(uint)(fVar135 <= fVar55) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(fVar156 <= fVar55) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(fVar72 <= fVar55) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(fVar57 <= fVar55) & valid.field_0.i[3];
                      iVar28 = movmskps(iVar28,(undefined1  [16])valid.field_0);
                      if (iVar28 == 0) break;
                      auVar90._0_4_ = valid.field_0.i[0] & (uint)fVar135;
                      auVar90._4_4_ = valid.field_0.i[1] & (uint)fVar156;
                      auVar90._8_4_ = valid.field_0.i[2] & (uint)fVar72;
                      auVar90._12_4_ = valid.field_0.i[3] & (uint)fVar57;
                      auVar113._0_8_ =
                           CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                      auVar113._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                      auVar113._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                      auVar113 = auVar113 | auVar90;
                      auVar124._4_4_ = auVar113._0_4_;
                      auVar124._0_4_ = auVar113._4_4_;
                      auVar124._8_4_ = auVar113._12_4_;
                      auVar124._12_4_ = auVar113._8_4_;
                      auVar150 = minps(auVar124,auVar113);
                      auVar91._0_8_ = auVar150._8_8_;
                      auVar91._8_4_ = auVar150._0_4_;
                      auVar91._12_4_ = auVar150._4_4_;
                      auVar150 = minps(auVar91,auVar150);
                      auVar92._0_8_ =
                           CONCAT44(-(uint)(auVar150._4_4_ == auVar113._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar150._0_4_ == auVar113._0_4_) & valid.field_0.i[0]);
                      auVar92._8_4_ = -(uint)(auVar150._8_4_ == auVar113._8_4_) & valid.field_0.i[2]
                      ;
                      auVar92._12_4_ =
                           -(uint)(auVar150._12_4_ == auVar113._12_4_) & valid.field_0.i[3];
                      iVar28 = movmskps(iVar28,auVar92);
                      aVar68 = valid.field_0;
                      if (iVar28 != 0) {
                        aVar68.i[2] = auVar92._8_4_;
                        aVar68._0_8_ = auVar92._0_8_;
                        aVar68.i[3] = auVar92._12_4_;
                      }
                      uVar37 = movmskps(iVar28,(undefined1  [16])aVar68);
                      uVar42 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar37);
                      lVar32 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        uVar37 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar150._4_4_ = uVar37;
        auVar150._0_4_ = uVar37;
        auVar150._8_4_ = uVar37;
        auVar150._12_4_ = uVar37;
        fVar71 = local_1028;
        fVar73 = fStack_1024;
        fVar93 = fStack_1020;
        fVar70 = fStack_101c;
        iVar216 = local_1038;
        iVar220 = iStack_1034;
        iVar224 = iStack_1030;
        iVar28 = iStack_102c;
        fVar94 = local_fd8;
        fVar95 = fStack_fd4;
        fVar125 = fStack_fd0;
        fVar56 = fStack_fcc;
        fVar135 = local_fe8;
        fVar156 = fStack_fe4;
        fVar159 = fStack_fe0;
        fVar55 = fStack_fdc;
        fVar161 = local_ff8;
        fVar146 = fStack_ff4;
        fVar162 = fStack_ff0;
        fVar72 = fStack_fec;
        fVar165 = local_1008;
        fVar171 = fStack_1004;
        fVar173 = fStack_1000;
        fVar57 = fStack_ffc;
        fVar175 = local_1018;
        fVar177 = fStack_1014;
        fVar179 = fStack_1010;
        fVar69 = fStack_100c;
      }
      else {
        p_Var17 = **(_func_int ***)(uVar42 & 0xfffffffffffffff0);
        (local_1228->super_RefCount)._vptr_RefCount = *(_func_int ***)(uVar42 & 0xfffffffffffffff0);
        uVar37 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar150._4_4_ = uVar37;
        auVar150._0_4_ = uVar37;
        auVar150._8_4_ = uVar37;
        auVar150._12_4_ = uVar37;
        root.ptr = (size_t)local_1228;
        if (p_Var17 != (_func_int *)0x0) {
          (pSVar30->ptr).ptr = (size_t)p_Var17;
          pSVar30->dist = 0;
          pSVar30 = pSVar30 + 1;
        }
      }
    }
    if (pSVar30 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }